

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  ulong uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  long lVar83;
  ulong uVar84;
  byte bVar85;
  byte bVar86;
  int iVar87;
  long lVar88;
  bool bVar89;
  ulong uVar90;
  uint uVar91;
  uint uVar167;
  uint uVar168;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  uint uVar170;
  uint uVar171;
  uint uVar172;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  uint uVar169;
  uint uVar173;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  vint4 bi_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar193;
  vint4 bi_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar206 [16];
  undefined1 auVar210 [32];
  float fVar211;
  vint4 bi;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar228;
  float fVar247;
  float fVar248;
  undefined1 auVar229 [16];
  float fVar249;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar246 [32];
  float fVar253;
  vint4 ai;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  vint4 ai_1;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar265 [32];
  undefined1 auVar264 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  float fVar271;
  vint4 ai_2;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar270 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  float fVar281;
  float fVar288;
  undefined1 auVar284 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar286;
  float fVar287;
  undefined1 auVar285 [64];
  undefined1 auVar289 [16];
  float fVar290;
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  float s;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar183 [32];
  
  uVar90 = (ulong)(byte)prim[1];
  lVar83 = uVar90 * 0x25;
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 4 + 6)));
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 5 + 6)));
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 6 + 6)));
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xf + 6)));
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x11 + 6)));
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x1a + 6)));
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0x1b + 6)));
  uVar193 = *(undefined4 *)(prim + lVar83 + 0x12);
  auVar300._4_4_ = uVar193;
  auVar300._0_4_ = uVar193;
  auVar300._8_4_ = uVar193;
  auVar300._12_4_ = uVar193;
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar92 = vsubps_avx512vl(auVar104,*(undefined1 (*) [16])(prim + lVar83 + 6));
  auVar93 = vpmovsxbd_avx512vl(ZEXT416(*(uint *)(prim + uVar90 * 0x1c + 6)));
  fVar24 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar83 + 0x16)) *
           *(float *)(prim + lVar83 + 0x1a);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar90 * 7 + 6);
  auVar25 = vpmovsxwd_avx(auVar104);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar90 * 0xb + 6);
  auVar26 = vpmovsxwd_avx(auVar108);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar90 * 9 + 6);
  auVar174 = vpmovsxwd_avx(auVar105);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar90 * 0xd + 6);
  auVar109 = vpmovsxwd_avx(auVar109);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar90 * 0x12 + 6);
  auVar2 = vpmovsxwd_avx(auVar2);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar90 * 0x16 + 6);
  auVar110 = vpmovsxwd_avx(auVar110);
  auVar104 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar104 = vinsertps_avx512f(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar92 = vmulps_avx512vl(auVar300,auVar92);
  auVar94 = vmulps_avx512vl(auVar300,auVar104);
  auVar95 = vcvtdq2ps_avx512vl(auVar103);
  auVar96 = vcvtdq2ps_avx512vl(auVar96);
  auVar97 = vcvtdq2ps_avx512vl(auVar97);
  auVar98 = vcvtdq2ps_avx512vl(auVar98);
  auVar99 = vcvtdq2ps_avx512vl(auVar99);
  auVar104 = vcvtdq2ps_avx(auVar100);
  auVar108 = vcvtdq2ps_avx(auVar101);
  auVar105 = vcvtdq2ps_avx(auVar102);
  auVar100 = vcvtdq2ps_avx512vl(auVar93);
  uVar193 = auVar94._0_4_;
  auVar289._4_4_ = uVar193;
  auVar289._0_4_ = uVar193;
  auVar289._8_4_ = uVar193;
  auVar289._12_4_ = uVar193;
  auVar101 = vshufps_avx512vl(auVar94,auVar94,0x55);
  auVar103 = vshufps_avx(auVar94,auVar94,0xaa);
  auVar102 = vmulps_avx512vl(auVar103,auVar97);
  auVar194._0_4_ = auVar103._0_4_ * auVar104._0_4_;
  auVar194._4_4_ = auVar103._4_4_ * auVar104._4_4_;
  auVar194._8_4_ = auVar103._8_4_ * auVar104._8_4_;
  auVar194._12_4_ = auVar103._12_4_ * auVar104._12_4_;
  auVar94._0_4_ = auVar100._0_4_ * auVar103._0_4_;
  auVar94._4_4_ = auVar100._4_4_ * auVar103._4_4_;
  auVar94._8_4_ = auVar100._8_4_ * auVar103._8_4_;
  auVar94._12_4_ = auVar100._12_4_ * auVar103._12_4_;
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar96);
  auVar102 = vfmadd231ps_avx512vl(auVar194,auVar101,auVar99);
  auVar101 = vfmadd231ps_avx512vl(auVar94,auVar105,auVar101);
  auVar93 = vfmadd231ps_avx512vl(auVar103,auVar289,auVar95);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar289,auVar98);
  auVar103 = vfmadd231ps_fma(auVar101,auVar108,auVar289);
  auVar101 = vbroadcastss_avx512vl(auVar92);
  auVar94 = vshufps_avx512vl(auVar92,auVar92,0x55);
  auVar92 = vshufps_avx512vl(auVar92,auVar92,0xaa);
  auVar97 = vmulps_avx512vl(auVar92,auVar97);
  auVar104 = vmulps_avx512vl(auVar92,auVar104);
  auVar100 = vmulps_avx512vl(auVar92,auVar100);
  auVar96 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar96);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,auVar99);
  auVar105 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar105);
  auVar94 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar95);
  auVar95 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar98);
  auVar298._8_4_ = 0x7fffffff;
  auVar298._0_8_ = 0x7fffffff7fffffff;
  auVar298._12_4_ = 0x7fffffff;
  auVar92 = vfmadd231ps_fma(auVar105,auVar101,auVar108);
  auVar104 = vandps_avx(auVar298,auVar93);
  auVar296._8_4_ = 0x219392ef;
  auVar296._0_8_ = 0x219392ef219392ef;
  auVar296._12_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar104,auVar296,1);
  bVar89 = (bool)((byte)uVar84 & 1);
  auVar106._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._0_4_;
  bVar89 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._4_4_;
  bVar89 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._8_4_;
  bVar89 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._12_4_;
  auVar104 = vandps_avx(auVar298,auVar102);
  uVar84 = vcmpps_avx512vl(auVar104,auVar296,1);
  bVar89 = (bool)((byte)uVar84 & 1);
  auVar93._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar102._0_4_;
  bVar89 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar102._4_4_;
  bVar89 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar102._8_4_;
  bVar89 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar102._12_4_;
  auVar104 = vandps_avx(auVar298,auVar103);
  uVar84 = vcmpps_avx512vl(auVar104,auVar296,1);
  bVar89 = (bool)((byte)uVar84 & 1);
  auVar107._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar103._0_4_;
  bVar89 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar103._4_4_;
  bVar89 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar103._8_4_;
  bVar89 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar103._12_4_;
  auVar108 = vrcp14ps_avx512vl(auVar106);
  auVar297._8_4_ = 0x3f800000;
  auVar297._0_8_ = 0x3f8000003f800000;
  auVar297._12_4_ = 0x3f800000;
  auVar104 = vfnmadd213ps_fma(auVar106,auVar108,auVar297);
  auVar105 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar93);
  auVar104 = vfnmadd213ps_fma(auVar93,auVar108,auVar297);
  auVar101 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar107);
  auVar104 = vfnmadd213ps_fma(auVar107,auVar108,auVar297);
  auVar102 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
  auVar254._4_4_ = fVar24;
  auVar254._0_4_ = fVar24;
  auVar254._8_4_ = fVar24;
  auVar254._12_4_ = fVar24;
  auVar104 = vcvtdq2ps_avx(auVar25);
  auVar108 = vcvtdq2ps_avx(auVar26);
  auVar108 = vsubps_avx(auVar108,auVar104);
  auVar25 = vfmadd213ps_fma(auVar108,auVar254,auVar104);
  auVar104 = vcvtdq2ps_avx(auVar174);
  auVar108 = vcvtdq2ps_avx(auVar109);
  auVar108 = vsubps_avx(auVar108,auVar104);
  auVar109 = vfmadd213ps_fma(auVar108,auVar254,auVar104);
  auVar104 = vcvtdq2ps_avx(auVar2);
  auVar108 = vcvtdq2ps_avx(auVar110);
  auVar108 = vsubps_avx(auVar108,auVar104);
  auVar2 = vfmadd213ps_fma(auVar108,auVar254,auVar104);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar90 * 0x14 + 6);
  auVar104 = vpmovsxwd_avx(auVar103);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar90 * 0x18 + 6);
  auVar108 = vpmovsxwd_avx(auVar96);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar104);
  auVar110 = vfmadd213ps_fma(auVar108,auVar254,auVar104);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar90 * 0x1d + 6);
  auVar104 = vpmovsxwd_avx(auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar90 * 0x21 + 6);
  auVar108 = vpmovsxwd_avx(auVar98);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar104);
  auVar103 = vfmadd213ps_fma(auVar108,auVar254,auVar104);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar90 * 0x1f + 6);
  auVar104 = vpmovsxwd_avx(auVar99);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar90 * 0x23 + 6);
  auVar108 = vpmovsxwd_avx(auVar100);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar104);
  auVar108 = vfmadd213ps_fma(auVar108,auVar254,auVar104);
  auVar104 = vsubps_avx512vl(auVar25,auVar94);
  auVar255._0_4_ = auVar105._0_4_ * auVar104._0_4_;
  auVar255._4_4_ = auVar105._4_4_ * auVar104._4_4_;
  auVar255._8_4_ = auVar105._8_4_ * auVar104._8_4_;
  auVar255._12_4_ = auVar105._12_4_ * auVar104._12_4_;
  auVar104 = vsubps_avx512vl(auVar109,auVar94);
  auVar212._0_4_ = auVar105._0_4_ * auVar104._0_4_;
  auVar212._4_4_ = auVar105._4_4_ * auVar104._4_4_;
  auVar212._8_4_ = auVar105._8_4_ * auVar104._8_4_;
  auVar212._12_4_ = auVar105._12_4_ * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar2,auVar95);
  auVar262._0_4_ = auVar101._0_4_ * auVar104._0_4_;
  auVar262._4_4_ = auVar101._4_4_ * auVar104._4_4_;
  auVar262._8_4_ = auVar101._8_4_ * auVar104._8_4_;
  auVar262._12_4_ = auVar101._12_4_ * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar110,auVar95);
  auVar95._0_4_ = auVar101._0_4_ * auVar104._0_4_;
  auVar95._4_4_ = auVar101._4_4_ * auVar104._4_4_;
  auVar95._8_4_ = auVar101._8_4_ * auVar104._8_4_;
  auVar95._12_4_ = auVar101._12_4_ * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar103,auVar92);
  auVar268._0_4_ = auVar102._0_4_ * auVar104._0_4_;
  auVar268._4_4_ = auVar102._4_4_ * auVar104._4_4_;
  auVar268._8_4_ = auVar102._8_4_ * auVar104._8_4_;
  auVar268._12_4_ = auVar102._12_4_ * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar108,auVar92);
  auVar174._0_4_ = auVar102._0_4_ * auVar104._0_4_;
  auVar174._4_4_ = auVar102._4_4_ * auVar104._4_4_;
  auVar174._8_4_ = auVar102._8_4_ * auVar104._8_4_;
  auVar174._12_4_ = auVar102._12_4_ * auVar104._12_4_;
  auVar104 = vpminsd_avx(auVar255,auVar212);
  auVar108 = vpminsd_avx(auVar262,auVar95);
  auVar104 = vmaxps_avx(auVar104,auVar108);
  auVar108 = vpminsd_avx(auVar268,auVar174);
  uVar193 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar101._4_4_ = uVar193;
  auVar101._0_4_ = uVar193;
  auVar101._8_4_ = uVar193;
  auVar101._12_4_ = uVar193;
  auVar108 = vmaxps_avx512vl(auVar108,auVar101);
  auVar104 = vmaxps_avx(auVar104,auVar108);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  local_720 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vpmaxsd_avx(auVar255,auVar212);
  auVar108 = vpmaxsd_avx(auVar262,auVar95);
  auVar104 = vminps_avx(auVar104,auVar108);
  auVar108 = vpmaxsd_avx(auVar268,auVar174);
  uVar193 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar25._4_4_ = uVar193;
  auVar25._0_4_ = uVar193;
  auVar25._8_4_ = uVar193;
  auVar25._12_4_ = uVar193;
  auVar108 = vminps_avx512vl(auVar108,auVar25);
  auVar104 = vminps_avx(auVar104,auVar108);
  auVar26._8_4_ = 0x3f800003;
  auVar26._0_8_ = 0x3f8000033f800003;
  auVar26._12_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar26);
  auVar108 = vpbroadcastd_avx512vl();
  uVar27 = vcmpps_avx512vl(local_720,auVar104,2);
  uVar30 = vpcmpgtd_avx512vl(auVar108,_DAT_01f4ad30);
  local_908 = (ulong)((byte)uVar27 & 0xf & (byte)uVar30);
  local_a48 = (undefined1 (*) [32])local_240;
  auVar192 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar192);
  local_910 = prim;
LAB_0194bf56:
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  auVar192 = ZEXT3264(auVar123);
  if (local_908 == 0) {
    return;
  }
  lVar83 = 0;
  for (uVar84 = local_908; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
    lVar83 = lVar83 + 1;
  }
  uVar3 = *(uint *)(local_910 + 2);
  uVar4 = *(uint *)(local_910 + lVar83 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar3].ptr;
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)uVar4 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar24 = (pGVar5->time_range).lower;
  fVar24 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x1c0) - fVar24) / ((pGVar5->time_range).upper - fVar24));
  auVar104 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
  auVar104 = vminss_avx(auVar104,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar104 = vmaxss_avx(ZEXT816(0) << 0x20,auVar104);
  fVar24 = fVar24 - auVar104._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar88 = (long)(int)auVar104._0_4_ * 0x38;
  lVar83 = *(long *)(_Var6 + 0x10 + lVar88);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar88);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar88);
  pfVar1 = (float *)(lVar7 + uVar84 * lVar8);
  auVar213._0_4_ = fVar24 * *pfVar1;
  auVar213._4_4_ = fVar24 * pfVar1[1];
  auVar213._8_4_ = fVar24 * pfVar1[2];
  auVar213._12_4_ = fVar24 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar84 + 1) * lVar8);
  auVar229._0_4_ = fVar24 * *pfVar1;
  auVar229._4_4_ = fVar24 * pfVar1[1];
  auVar229._8_4_ = fVar24 * pfVar1[2];
  auVar229._12_4_ = fVar24 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar84 + 2) * lVar8);
  auVar256._0_4_ = fVar24 * *pfVar1;
  auVar256._4_4_ = fVar24 * pfVar1[1];
  auVar256._8_4_ = fVar24 * pfVar1[2];
  auVar256._12_4_ = fVar24 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar84 + 3));
  auVar195._0_4_ = fVar24 * *pfVar1;
  auVar195._4_4_ = fVar24 * pfVar1[1];
  auVar195._8_4_ = fVar24 * pfVar1[2];
  auVar195._12_4_ = fVar24 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar88);
  fVar24 = 1.0 - fVar24;
  auVar175._4_4_ = fVar24;
  auVar175._0_4_ = fVar24;
  auVar175._8_4_ = fVar24;
  auVar175._12_4_ = fVar24;
  auVar105 = vfmadd231ps_fma(auVar213,auVar175,*(undefined1 (*) [16])(lVar7 + lVar83 * uVar84));
  auVar109 = vfmadd231ps_fma(auVar229,auVar175,*(undefined1 (*) [16])(lVar7 + lVar83 * (uVar84 + 1))
                            );
  auVar2 = vfmadd231ps_fma(auVar256,auVar175,*(undefined1 (*) [16])(lVar7 + lVar83 * (uVar84 + 2)));
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar108 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar193 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar299._4_4_ = uVar193;
  auVar299._0_4_ = uVar193;
  auVar299._8_4_ = uVar193;
  auVar299._12_4_ = uVar193;
  local_860._16_4_ = uVar193;
  local_860._0_16_ = auVar299;
  local_860._20_4_ = uVar193;
  local_860._24_4_ = uVar193;
  local_860._28_4_ = uVar193;
  local_6e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar104 = vunpcklps_avx512vl(auVar299,local_6e0._0_16_);
  auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar96 = auVar111._0_16_;
  local_9f0 = vinsertps_avx512f(auVar104,auVar96,0x28);
  auVar292 = ZEXT1664(local_9f0);
  auVar269._0_4_ = auVar105._0_4_ + auVar109._0_4_;
  auVar269._4_4_ = auVar105._4_4_ + auVar109._4_4_;
  auVar269._8_4_ = auVar105._8_4_ + auVar109._8_4_;
  auVar269._12_4_ = auVar105._12_4_ + auVar109._12_4_;
  auVar92._8_4_ = 0x3f000000;
  auVar92._0_8_ = 0x3f0000003f000000;
  auVar92._12_4_ = 0x3f000000;
  auVar104 = vmulps_avx512vl(auVar269,auVar92);
  auVar104 = vsubps_avx(auVar104,auVar108);
  auVar104 = vdpps_avx(auVar104,local_9f0,0x7f);
  fVar24 = *(float *)(ray + k * 4 + 0xc0);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar275._4_12_ = ZEXT812(0) << 0x20;
  auVar275._0_4_ = local_a00._0_4_;
  auVar103 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar275);
  auVar110 = vfnmadd213ss_fma(auVar103,local_a00,ZEXT416(0x40000000));
  local_660 = auVar104._0_4_ * auVar110._0_4_ * auVar103._0_4_;
  auVar276._4_4_ = local_660;
  auVar276._0_4_ = local_660;
  auVar276._8_4_ = local_660;
  auVar276._12_4_ = local_660;
  fStack_810 = local_660;
  _local_820 = auVar276;
  fStack_80c = local_660;
  fStack_808 = local_660;
  fStack_804 = local_660;
  auVar104 = vfmadd231ps_fma(auVar108,local_9f0,auVar276);
  auVar104 = vblendps_avx(auVar104,ZEXT816(0) << 0x40,8);
  auVar108 = vsubps_avx(auVar105,auVar104);
  auVar280 = ZEXT1664(auVar108);
  auVar105 = vsubps_avx(auVar2,auVar104);
  auVar2 = vfmadd231ps_fma(auVar195,auVar175,*(undefined1 (*) [16])(lVar7 + lVar83 * (uVar84 + 3)));
  auVar109 = vsubps_avx(auVar109,auVar104);
  auVar104 = vsubps_avx(auVar2,auVar104);
  auVar285 = ZEXT1664(auVar104);
  auVar267 = ZEXT3264(_DAT_01f7b040);
  auVar112 = vbroadcastss_avx512vl(auVar108);
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  local_980 = ZEXT1632(auVar108);
  auVar113 = vpermps_avx512vl(auVar122,local_980);
  auVar126._8_4_ = 2;
  auVar126._0_8_ = 0x200000002;
  auVar126._12_4_ = 2;
  auVar126._16_4_ = 2;
  auVar126._20_4_ = 2;
  auVar126._24_4_ = 2;
  auVar126._28_4_ = 2;
  auVar114 = vpermps_avx512vl(auVar126,local_980);
  auVar124._8_4_ = 3;
  auVar124._0_8_ = 0x300000003;
  auVar124._12_4_ = 3;
  auVar124._16_4_ = 3;
  auVar124._20_4_ = 3;
  auVar124._24_4_ = 3;
  auVar124._28_4_ = 3;
  auVar115 = vpermps_avx512vl(auVar124,local_980);
  auVar116 = vbroadcastss_avx512vl(auVar109);
  local_9c0 = ZEXT1632(auVar109);
  auVar117 = vpermps_avx512vl(auVar122,local_9c0);
  auVar118 = vpermps_avx512vl(auVar126,local_9c0);
  auVar119 = vpermps_avx512vl(auVar124,local_9c0);
  auVar120 = vbroadcastss_avx512vl(auVar105);
  local_9a0 = ZEXT1632(auVar105);
  auVar121 = vpermps_avx512vl(auVar122,local_9a0);
  local_5e0 = vpermps_avx512vl(auVar126,local_9a0);
  local_560 = vpermps_avx2(auVar124,local_9a0);
  local_600 = auVar104._0_4_;
  _local_9e0 = ZEXT1632(auVar104);
  local_620 = vpermps_avx2(auVar122,_local_9e0);
  local_580 = vpermps_avx2(auVar126,_local_9e0);
  local_640 = vpermps_avx512vl(auVar124,_local_9e0);
  auVar104 = vmulss_avx512f(auVar96,auVar96);
  auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),local_6e0,local_6e0);
  auVar104 = vfmadd231ps_fma(auVar122,local_860,local_860);
  local_5a0._0_4_ = auVar104._0_4_;
  local_5a0._4_4_ = local_5a0._0_4_;
  local_5a0._8_4_ = local_5a0._0_4_;
  local_5a0._12_4_ = local_5a0._0_4_;
  local_5a0._16_4_ = local_5a0._0_4_;
  local_5a0._20_4_ = local_5a0._0_4_;
  local_5a0._24_4_ = local_5a0._0_4_;
  local_5a0._28_4_ = local_5a0._0_4_;
  local_5c0 = vandps_avx(auVar123,local_5a0);
  local_960 = ZEXT416((uint)local_660);
  local_660 = fVar24 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar164 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar164);
  uVar84 = 0;
  iVar87 = 1;
  auVar164 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar164);
  auVar104 = vsqrtss_avx(local_a00,local_a00);
  auVar108 = vsqrtss_avx(local_a00,local_a00);
  auVar164 = ZEXT1664(ZEXT816(0x3f80000000000000));
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  do {
    local_710 = auVar164._0_16_;
    auVar105 = vmovshdup_avx(local_710);
    auVar105 = vsubps_avx(auVar105,local_710);
    auVar176._0_4_ = auVar105._0_4_;
    fVar253 = auVar176._0_4_ * 0.04761905;
    uVar193 = auVar164._0_4_;
    auVar261._4_4_ = uVar193;
    auVar261._0_4_ = uVar193;
    auVar261._8_4_ = uVar193;
    auVar261._12_4_ = uVar193;
    auVar261._16_4_ = uVar193;
    auVar261._20_4_ = uVar193;
    auVar261._24_4_ = uVar193;
    auVar261._28_4_ = uVar193;
    auVar176._4_4_ = auVar176._0_4_;
    auVar176._8_4_ = auVar176._0_4_;
    auVar176._12_4_ = auVar176._0_4_;
    auVar183._16_4_ = auVar176._0_4_;
    auVar183._0_16_ = auVar176;
    auVar183._20_4_ = auVar176._0_4_;
    auVar183._24_4_ = auVar176._0_4_;
    auVar183._28_4_ = auVar176._0_4_;
    auVar105 = vfmadd231ps_fma(auVar261,auVar183,auVar267._0_32_);
    auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar123 = vsubps_avx512vl(auVar123,ZEXT1632(auVar105));
    fVar228 = auVar105._0_4_;
    fVar247 = auVar105._4_4_;
    fVar248 = auVar105._8_4_;
    fVar249 = auVar105._12_4_;
    fVar251 = auVar123._0_4_;
    fVar252 = auVar123._4_4_;
    fVar271 = auVar123._8_4_;
    fVar272 = auVar123._12_4_;
    fVar273 = auVar123._16_4_;
    fVar211 = auVar123._20_4_;
    fVar274 = auVar123._24_4_;
    auVar130._4_4_ = fVar252 * fVar252 * -fVar247;
    auVar130._0_4_ = fVar251 * fVar251 * -fVar228;
    auVar130._8_4_ = fVar271 * fVar271 * -fVar248;
    auVar130._12_4_ = fVar272 * fVar272 * -fVar249;
    auVar130._16_4_ = fVar273 * fVar273 * -0.0;
    auVar130._20_4_ = fVar211 * fVar211 * -0.0;
    auVar130._24_4_ = fVar274 * fVar274 * -0.0;
    auVar130._28_4_ = 0x80000000;
    auVar267._28_36_ = auVar280._28_36_;
    auVar267._0_28_ =
         ZEXT1628(CONCAT412(fVar249 * fVar249,
                            CONCAT48(fVar248 * fVar248,CONCAT44(fVar247 * fVar247,fVar228 * fVar228)
                                    )));
    fVar281 = fVar228 * 3.0;
    fVar286 = fVar247 * 3.0;
    fVar287 = fVar248 * 3.0;
    fVar288 = fVar249 * 3.0;
    auVar280._28_36_ = auVar285._28_36_;
    auVar280._0_28_ = ZEXT1628(CONCAT412(fVar288,CONCAT48(fVar287,CONCAT44(fVar286,fVar281))));
    fVar290 = auVar285._28_4_ + -5.0;
    auVar144._0_4_ = (fVar281 + -5.0) * fVar228 * fVar228 + 2.0;
    auVar144._4_4_ = (fVar286 + -5.0) * fVar247 * fVar247 + 2.0;
    auVar144._8_4_ = (fVar287 + -5.0) * fVar248 * fVar248 + 2.0;
    auVar144._12_4_ = (fVar288 + -5.0) * fVar249 * fVar249 + 2.0;
    auVar144._16_4_ = 0x40000000;
    auVar144._20_4_ = 0x40000000;
    auVar144._24_4_ = 0x40000000;
    auVar144._28_4_ = auVar164._28_4_ + 2.0;
    auVar164._0_4_ = fVar251 * fVar251;
    auVar164._4_4_ = fVar252 * fVar252;
    auVar164._8_4_ = fVar271 * fVar271;
    auVar164._12_4_ = fVar272 * fVar272;
    auVar164._16_4_ = fVar273 * fVar273;
    auVar164._20_4_ = fVar211 * fVar211;
    auVar164._28_36_ = auVar192._28_36_;
    auVar164._24_4_ = fVar274 * fVar274;
    auVar145._0_4_ = auVar164._0_4_ * (fVar251 * 3.0 + -5.0) + 2.0;
    auVar145._4_4_ = auVar164._4_4_ * (fVar252 * 3.0 + -5.0) + 2.0;
    auVar145._8_4_ = auVar164._8_4_ * (fVar271 * 3.0 + -5.0) + 2.0;
    auVar145._12_4_ = auVar164._12_4_ * (fVar272 * 3.0 + -5.0) + 2.0;
    auVar145._16_4_ = auVar164._16_4_ * (fVar273 * 3.0 + -5.0) + 2.0;
    auVar145._20_4_ = auVar164._20_4_ * (fVar211 * 3.0 + -5.0) + 2.0;
    auVar145._24_4_ = auVar164._24_4_ * (fVar274 * 3.0 + -5.0) + 2.0;
    auVar145._28_4_ = auVar292._28_4_ + -5.0 + 2.0;
    fVar250 = auVar123._28_4_;
    auVar131._4_4_ = fVar247 * fVar247 * -fVar252;
    auVar131._0_4_ = fVar228 * fVar228 * -fVar251;
    auVar131._8_4_ = fVar248 * fVar248 * -fVar271;
    auVar131._12_4_ = fVar249 * fVar249 * -fVar272;
    auVar131._16_4_ = -fVar273 * 0.0 * 0.0;
    auVar131._20_4_ = -fVar211 * 0.0 * 0.0;
    auVar131._24_4_ = -fVar274 * 0.0 * 0.0;
    auVar131._28_4_ = -fVar250;
    auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar123 = vmulps_avx512vl(auVar130,auVar124);
    auVar125 = vmulps_avx512vl(auVar144,auVar124);
    auVar122 = vmulps_avx512vl(auVar145,auVar124);
    auVar126 = vmulps_avx512vl(auVar131,auVar124);
    auVar132._4_4_ = fStack_5fc * auVar126._4_4_;
    auVar132._0_4_ = local_600 * auVar126._0_4_;
    auVar132._8_4_ = fStack_5f8 * auVar126._8_4_;
    auVar132._12_4_ = fStack_5f4 * auVar126._12_4_;
    auVar132._16_4_ = fStack_5f0 * auVar126._16_4_;
    auVar132._20_4_ = fStack_5ec * auVar126._20_4_;
    auVar132._24_4_ = fStack_5e8 * auVar126._24_4_;
    auVar132._28_4_ = auVar145._28_4_;
    auVar134._4_4_ = local_620._4_4_ * auVar126._4_4_;
    auVar134._0_4_ = local_620._0_4_ * auVar126._0_4_;
    auVar134._8_4_ = local_620._8_4_ * auVar126._8_4_;
    auVar134._12_4_ = local_620._12_4_ * auVar126._12_4_;
    auVar134._16_4_ = local_620._16_4_ * auVar126._16_4_;
    auVar134._20_4_ = local_620._20_4_ * auVar126._20_4_;
    auVar134._24_4_ = local_620._24_4_ * auVar126._24_4_;
    auVar134._28_4_ = auVar144._28_4_;
    auVar127 = vmulps_avx512vl(local_580,auVar126);
    auVar126 = vmulps_avx512vl(local_640,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar132,auVar122,auVar120);
    auVar129 = vfmadd231ps_avx512vl(auVar134,auVar122,auVar121);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar122,local_5e0);
    auVar122 = vfmadd231ps_avx512vl(auVar126,local_560,auVar122);
    auVar126 = vfmadd231ps_avx512vl(auVar128,auVar125,auVar116);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar125,auVar117);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar125,auVar118);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,auVar125);
    auVar130 = vfmadd231ps_avx512vl(auVar126,auVar123,auVar112);
    auVar131 = vfmadd231ps_avx512vl(auVar128,auVar123,auVar113);
    auVar132 = vfmadd231ps_avx512vl(auVar127,auVar123,auVar114);
    auVar128 = vfmadd231ps_avx512vl(auVar122,auVar115,auVar123);
    auVar135._4_4_ = (fVar252 + fVar252) * fVar247;
    auVar135._0_4_ = (fVar251 + fVar251) * fVar228;
    auVar135._8_4_ = (fVar271 + fVar271) * fVar248;
    auVar135._12_4_ = (fVar272 + fVar272) * fVar249;
    auVar135._16_4_ = (fVar273 + fVar273) * 0.0;
    auVar135._20_4_ = (fVar211 + fVar211) * 0.0;
    auVar135._24_4_ = (fVar274 + fVar274) * 0.0;
    auVar135._28_4_ = auVar125._28_4_;
    auVar123 = vsubps_avx(auVar135,auVar164._0_32_);
    auVar146._0_28_ =
         ZEXT1628(CONCAT412((fVar249 + fVar249) * (fVar288 + -5.0) + fVar288 * fVar249,
                            CONCAT48((fVar248 + fVar248) * (fVar287 + -5.0) + fVar287 * fVar248,
                                     CONCAT44((fVar247 + fVar247) * (fVar286 + -5.0) +
                                              fVar286 * fVar247,
                                              (fVar228 + fVar228) * (fVar281 + -5.0) +
                                              fVar281 * fVar228))));
    auVar146._28_4_ = fVar290 + 0.0;
    auVar127._8_4_ = 0x40000000;
    auVar127._0_8_ = 0x4000000040000000;
    auVar127._12_4_ = 0x40000000;
    auVar127._16_4_ = 0x40000000;
    auVar127._20_4_ = 0x40000000;
    auVar127._24_4_ = 0x40000000;
    auVar127._28_4_ = 0x40000000;
    auVar122 = vaddps_avx512vl(auVar280._0_32_,auVar127);
    auVar136._4_4_ = (fVar252 + fVar252) * auVar122._4_4_;
    auVar136._0_4_ = (fVar251 + fVar251) * auVar122._0_4_;
    auVar136._8_4_ = (fVar271 + fVar271) * auVar122._8_4_;
    auVar136._12_4_ = (fVar272 + fVar272) * auVar122._12_4_;
    auVar136._16_4_ = (fVar273 + fVar273) * auVar122._16_4_;
    auVar136._20_4_ = (fVar211 + fVar211) * auVar122._20_4_;
    auVar136._24_4_ = (fVar274 + fVar274) * auVar122._24_4_;
    auVar136._28_4_ = auVar122._28_4_;
    auVar137._4_4_ = fVar252 * 3.0 * fVar252;
    auVar137._0_4_ = fVar251 * 3.0 * fVar251;
    auVar137._8_4_ = fVar271 * 3.0 * fVar271;
    auVar137._12_4_ = fVar272 * 3.0 * fVar272;
    auVar137._16_4_ = fVar273 * 3.0 * fVar273;
    auVar137._20_4_ = fVar211 * 3.0 * fVar211;
    auVar137._24_4_ = fVar274 * 3.0 * fVar274;
    auVar137._28_4_ = fVar250;
    auVar122 = vsubps_avx(auVar136,auVar137);
    auVar126 = vsubps_avx(auVar267._0_32_,auVar135);
    auVar127 = vmulps_avx512vl(auVar123,auVar124);
    auVar129 = vmulps_avx512vl(auVar146,auVar124);
    auVar122 = vmulps_avx512vl(auVar122,auVar124);
    auVar126 = vmulps_avx512vl(auVar126,auVar124);
    auVar138._4_4_ = fStack_5fc * auVar126._4_4_;
    auVar138._0_4_ = local_600 * auVar126._0_4_;
    auVar138._8_4_ = fStack_5f8 * auVar126._8_4_;
    auVar138._12_4_ = fStack_5f4 * auVar126._12_4_;
    auVar138._16_4_ = fStack_5f0 * auVar126._16_4_;
    auVar138._20_4_ = fStack_5ec * auVar126._20_4_;
    auVar138._24_4_ = fStack_5e8 * auVar126._24_4_;
    auVar138._28_4_ = fVar290;
    auVar139._4_4_ = local_620._4_4_ * auVar126._4_4_;
    auVar139._0_4_ = local_620._0_4_ * auVar126._0_4_;
    auVar139._8_4_ = local_620._8_4_ * auVar126._8_4_;
    auVar139._12_4_ = local_620._12_4_ * auVar126._12_4_;
    auVar139._16_4_ = local_620._16_4_ * auVar126._16_4_;
    auVar139._20_4_ = local_620._20_4_ * auVar126._20_4_;
    auVar139._24_4_ = local_620._24_4_ * auVar126._24_4_;
    auVar139._28_4_ = auVar123._28_4_;
    auVar123 = vmulps_avx512vl(local_580,auVar126);
    auVar126 = vmulps_avx512vl(local_640,auVar126);
    auVar124 = vfmadd231ps_avx512vl(auVar138,auVar122,auVar120);
    auVar133 = vfmadd231ps_avx512vl(auVar139,auVar122,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar122,local_5e0);
    auVar122 = vfmadd231ps_avx512vl(auVar126,local_560,auVar122);
    auVar126 = vfmadd231ps_avx512vl(auVar124,auVar129,auVar116);
    auVar124 = vfmadd231ps_avx512vl(auVar133,auVar129,auVar117);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar129,auVar118);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,auVar129);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar127,auVar112);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar127,auVar113);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,auVar114);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar115,auVar127);
    auVar151._4_4_ = auVar126._4_4_ * fVar253;
    auVar151._0_4_ = auVar126._0_4_ * fVar253;
    auVar151._8_4_ = auVar126._8_4_ * fVar253;
    auVar151._12_4_ = auVar126._12_4_ * fVar253;
    auVar151._16_4_ = auVar126._16_4_ * fVar253;
    auVar151._20_4_ = auVar126._20_4_ * fVar253;
    auVar151._24_4_ = auVar126._24_4_ * fVar253;
    auVar151._28_4_ = fVar250 + fVar250;
    auVar152._4_4_ = auVar124._4_4_ * fVar253;
    auVar152._0_4_ = auVar124._0_4_ * fVar253;
    auVar152._8_4_ = auVar124._8_4_ * fVar253;
    auVar152._12_4_ = auVar124._12_4_ * fVar253;
    auVar152._16_4_ = auVar124._16_4_ * fVar253;
    auVar152._20_4_ = auVar124._20_4_ * fVar253;
    auVar152._24_4_ = auVar124._24_4_ * fVar253;
    auVar152._28_4_ = auVar125._28_4_;
    auVar153._4_4_ = auVar123._4_4_ * fVar253;
    auVar153._0_4_ = auVar123._0_4_ * fVar253;
    auVar153._8_4_ = auVar123._8_4_ * fVar253;
    auVar153._12_4_ = auVar123._12_4_ * fVar253;
    auVar153._16_4_ = auVar123._16_4_ * fVar253;
    auVar153._20_4_ = auVar123._20_4_ * fVar253;
    auVar153._24_4_ = auVar123._24_4_ * fVar253;
    auVar153._28_4_ = 0;
    fVar228 = fVar253 * auVar122._0_4_;
    fVar247 = fVar253 * auVar122._4_4_;
    auVar142._4_4_ = fVar247;
    auVar142._0_4_ = fVar228;
    fVar248 = fVar253 * auVar122._8_4_;
    auVar142._8_4_ = fVar248;
    fVar249 = fVar253 * auVar122._12_4_;
    auVar142._12_4_ = fVar249;
    fVar250 = fVar253 * auVar122._16_4_;
    auVar142._16_4_ = fVar250;
    fVar251 = fVar253 * auVar122._20_4_;
    auVar142._20_4_ = fVar251;
    fVar252 = fVar253 * auVar122._24_4_;
    auVar142._24_4_ = fVar252;
    auVar142._28_4_ = fVar253;
    auVar105 = vxorps_avx512vl(auVar119._0_16_,auVar119._0_16_);
    auVar134 = vpermt2ps_avx512vl(auVar130,_DAT_01fb9fc0,ZEXT1632(auVar105));
    auVar135 = vpermt2ps_avx512vl(auVar131,_DAT_01fb9fc0,ZEXT1632(auVar105));
    auVar192 = ZEXT3264(auVar135);
    auVar126 = ZEXT1632(auVar105);
    auVar136 = vpermt2ps_avx512vl(auVar132,_DAT_01fb9fc0,auVar126);
    auVar292 = ZEXT3264(auVar136);
    auVar147._0_4_ = auVar128._0_4_ + fVar228;
    auVar147._4_4_ = auVar128._4_4_ + fVar247;
    auVar147._8_4_ = auVar128._8_4_ + fVar248;
    auVar147._12_4_ = auVar128._12_4_ + fVar249;
    auVar147._16_4_ = auVar128._16_4_ + fVar250;
    auVar147._20_4_ = auVar128._20_4_ + fVar251;
    auVar147._24_4_ = auVar128._24_4_ + fVar252;
    auVar147._28_4_ = auVar128._28_4_ + fVar253;
    auVar123 = vmaxps_avx(auVar128,auVar147);
    auVar122 = vminps_avx(auVar128,auVar147);
    auVar128 = vpermt2ps_avx512vl(auVar128,_DAT_01fb9fc0,auVar126);
    auVar137 = vpermt2ps_avx512vl(auVar151,_DAT_01fb9fc0,auVar126);
    auVar138 = vpermt2ps_avx512vl(auVar152,_DAT_01fb9fc0,auVar126);
    auVar147 = ZEXT1632(auVar105);
    auVar139 = vpermt2ps_avx512vl(auVar153,_DAT_01fb9fc0,auVar147);
    auVar126 = vpermt2ps_avx512vl(auVar142,_DAT_01fb9fc0,auVar147);
    auVar129 = vsubps_avx512vl(auVar128,auVar126);
    auVar126 = vsubps_avx(auVar134,auVar130);
    auVar285 = ZEXT3264(auVar126);
    auVar124 = vsubps_avx(auVar135,auVar131);
    auVar280 = ZEXT3264(auVar124);
    auVar127 = vsubps_avx(auVar136,auVar132);
    auVar125 = vmulps_avx512vl(auVar124,auVar153);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar152,auVar127);
    auVar133 = vmulps_avx512vl(auVar127,auVar151);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar153,auVar126);
    auVar140 = vmulps_avx512vl(auVar126,auVar152);
    auVar140 = vfmsub231ps_avx512vl(auVar140,auVar151,auVar124);
    auVar140 = vmulps_avx512vl(auVar140,auVar140);
    auVar133 = vfmadd231ps_avx512vl(auVar140,auVar133,auVar133);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar125,auVar125);
    auVar125 = vmulps_avx512vl(auVar127,auVar127);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar140 = vfmadd231ps_avx512vl(auVar125,auVar126,auVar126);
    auVar141 = vrcp14ps_avx512vl(auVar140);
    auVar125._8_4_ = 0x3f800000;
    auVar125._0_8_ = 0x3f8000003f800000;
    auVar125._12_4_ = 0x3f800000;
    auVar125._16_4_ = 0x3f800000;
    auVar125._20_4_ = 0x3f800000;
    auVar125._24_4_ = 0x3f800000;
    auVar125._28_4_ = 0x3f800000;
    auVar125 = vfnmadd213ps_avx512vl(auVar141,auVar140,auVar125);
    auVar125 = vfmadd132ps_avx512vl(auVar125,auVar141,auVar141);
    auVar133 = vmulps_avx512vl(auVar133,auVar125);
    auVar141 = vmulps_avx512vl(auVar124,auVar139);
    auVar141 = vfmsub231ps_avx512vl(auVar141,auVar138,auVar127);
    auVar142 = vmulps_avx512vl(auVar127,auVar137);
    auVar142 = vfmsub231ps_avx512vl(auVar142,auVar139,auVar126);
    auVar143 = vmulps_avx512vl(auVar126,auVar138);
    auVar143 = vfmsub231ps_avx512vl(auVar143,auVar137,auVar124);
    auVar143 = vmulps_avx512vl(auVar143,auVar143);
    auVar142 = vfmadd231ps_avx512vl(auVar143,auVar142,auVar142);
    auVar141 = vfmadd231ps_avx512vl(auVar142,auVar141,auVar141);
    auVar125 = vmulps_avx512vl(auVar141,auVar125);
    auVar125 = vmaxps_avx512vl(auVar133,auVar125);
    auVar125 = vsqrtps_avx512vl(auVar125);
    auVar133 = vmaxps_avx512vl(auVar129,auVar128);
    auVar123 = vmaxps_avx512vl(auVar123,auVar133);
    auVar141 = vaddps_avx512vl(auVar125,auVar123);
    auVar123 = vminps_avx512vl(auVar129,auVar128);
    auVar123 = vminps_avx(auVar122,auVar123);
    auVar123 = vsubps_avx512vl(auVar123,auVar125);
    auVar128._8_4_ = 0x3f800002;
    auVar128._0_8_ = 0x3f8000023f800002;
    auVar128._12_4_ = 0x3f800002;
    auVar128._16_4_ = 0x3f800002;
    auVar128._20_4_ = 0x3f800002;
    auVar128._24_4_ = 0x3f800002;
    auVar128._28_4_ = 0x3f800002;
    auVar122 = vmulps_avx512vl(auVar141,auVar128);
    auVar129._8_4_ = 0x3f7ffffc;
    auVar129._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar129._12_4_ = 0x3f7ffffc;
    auVar129._16_4_ = 0x3f7ffffc;
    auVar129._20_4_ = 0x3f7ffffc;
    auVar129._24_4_ = 0x3f7ffffc;
    auVar129._28_4_ = 0x3f7ffffc;
    auVar123 = vmulps_avx512vl(auVar123,auVar129);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar125 = vrsqrt14ps_avx512vl(auVar140);
    auVar133._8_4_ = 0xbf000000;
    auVar133._0_8_ = 0xbf000000bf000000;
    auVar133._12_4_ = 0xbf000000;
    auVar133._16_4_ = 0xbf000000;
    auVar133._20_4_ = 0xbf000000;
    auVar133._24_4_ = 0xbf000000;
    auVar133._28_4_ = 0xbf000000;
    auVar128 = vmulps_avx512vl(auVar140,auVar133);
    fVar253 = auVar125._0_4_;
    fVar228 = auVar125._4_4_;
    fVar247 = auVar125._8_4_;
    fVar248 = auVar125._12_4_;
    fVar249 = auVar125._16_4_;
    fVar250 = auVar125._20_4_;
    fVar251 = auVar125._24_4_;
    auVar143._4_4_ = fVar228 * fVar228 * fVar228 * auVar128._4_4_;
    auVar143._0_4_ = fVar253 * fVar253 * fVar253 * auVar128._0_4_;
    auVar143._8_4_ = fVar247 * fVar247 * fVar247 * auVar128._8_4_;
    auVar143._12_4_ = fVar248 * fVar248 * fVar248 * auVar128._12_4_;
    auVar143._16_4_ = fVar249 * fVar249 * fVar249 * auVar128._16_4_;
    auVar143._20_4_ = fVar250 * fVar250 * fVar250 * auVar128._20_4_;
    auVar143._24_4_ = fVar251 * fVar251 * fVar251 * auVar128._24_4_;
    auVar143._28_4_ = auVar141._28_4_;
    auVar140._8_4_ = 0x3fc00000;
    auVar140._0_8_ = 0x3fc000003fc00000;
    auVar140._12_4_ = 0x3fc00000;
    auVar140._16_4_ = 0x3fc00000;
    auVar140._20_4_ = 0x3fc00000;
    auVar140._24_4_ = 0x3fc00000;
    auVar140._28_4_ = 0x3fc00000;
    auVar125 = vfmadd231ps_avx512vl(auVar143,auVar125,auVar140);
    auVar128 = vmulps_avx512vl(auVar126,auVar125);
    auVar129 = vmulps_avx512vl(auVar124,auVar125);
    auVar133 = vmulps_avx512vl(auVar127,auVar125);
    auVar140 = vsubps_avx512vl(auVar147,auVar130);
    auVar142 = vsubps_avx512vl(auVar147,auVar131);
    auVar143 = vsubps_avx512vl(auVar147,auVar132);
    auVar141 = vmulps_avx512vl(auVar111,auVar143);
    auVar141 = vfmadd231ps_avx512vl(auVar141,local_6e0,auVar142);
    auVar141 = vfmadd231ps_avx512vl(auVar141,local_860,auVar140);
    auVar144 = vmulps_avx512vl(auVar143,auVar143);
    auVar144 = vfmadd231ps_avx512vl(auVar144,auVar142,auVar142);
    auVar144 = vfmadd231ps_avx512vl(auVar144,auVar140,auVar140);
    auVar145 = vmulps_avx512vl(auVar111,auVar133);
    auVar145 = vfmadd231ps_avx512vl(auVar145,auVar129,local_6e0);
    auVar145 = vfmadd231ps_avx512vl(auVar145,auVar128,local_860);
    auVar133 = vmulps_avx512vl(auVar143,auVar133);
    auVar129 = vfmadd231ps_avx512vl(auVar133,auVar142,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar140,auVar128);
    auVar129 = vmulps_avx512vl(auVar145,auVar145);
    auVar133 = vsubps_avx512vl(local_5a0,auVar129);
    auVar146 = vmulps_avx512vl(auVar145,auVar128);
    auVar141 = vsubps_avx512vl(auVar141,auVar146);
    auVar146 = vaddps_avx512vl(auVar141,auVar141);
    auVar141 = vmulps_avx512vl(auVar128,auVar128);
    auVar144 = vsubps_avx512vl(auVar144,auVar141);
    auVar122 = vsubps_avx512vl(auVar144,auVar122);
    local_a80 = vmulps_avx512vl(auVar146,auVar146);
    auVar141._8_4_ = 0x40800000;
    auVar141._0_8_ = 0x4080000040800000;
    auVar141._12_4_ = 0x40800000;
    auVar141._16_4_ = 0x40800000;
    auVar141._20_4_ = 0x40800000;
    auVar141._24_4_ = 0x40800000;
    auVar141._28_4_ = 0x40800000;
    _local_880 = vmulps_avx512vl(auVar133,auVar141);
    auVar141 = vmulps_avx512vl(_local_880,auVar122);
    auVar141 = vsubps_avx512vl(local_a80,auVar141);
    uVar90 = vcmpps_avx512vl(auVar141,auVar147,5);
    bVar79 = (byte)uVar90;
    if (bVar79 == 0) {
LAB_0194ccf8:
      auVar267 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      local_800._0_32_ = auVar144;
      auVar141 = vsqrtps_avx512vl(auVar141);
      local_8a0 = vaddps_avx512vl(auVar133,auVar133);
      local_8c0 = vrcp14ps_avx512vl(local_8a0);
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = 0x3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      auVar148._16_4_ = 0x3f800000;
      auVar148._20_4_ = 0x3f800000;
      auVar148._24_4_ = 0x3f800000;
      auVar148._28_4_ = 0x3f800000;
      auVar147 = vfnmadd213ps_avx512vl(local_8c0,local_8a0,auVar148);
      auVar147 = vfmadd132ps_avx512vl(auVar147,local_8c0,local_8c0);
      auVar41._8_4_ = 0x80000000;
      auVar41._0_8_ = 0x8000000080000000;
      auVar41._12_4_ = 0x80000000;
      auVar41._16_4_ = 0x80000000;
      auVar41._20_4_ = 0x80000000;
      auVar41._24_4_ = 0x80000000;
      auVar41._28_4_ = 0x80000000;
      local_8e0 = vxorps_avx512vl(auVar146,auVar41);
      auVar148 = vsubps_avx512vl(local_8e0,auVar141);
      local_aa0 = vmulps_avx512vl(auVar148,auVar147);
      auVar141 = vsubps_avx512vl(auVar141,auVar146);
      local_a20 = vmulps_avx512vl(auVar141,auVar147);
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar147 = vblendmps_avx512vl(auVar141,local_aa0);
      auVar149._0_4_ =
           (uint)(bVar79 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar141._0_4_;
      bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
      auVar149._4_4_ = (uint)bVar89 * auVar147._4_4_ | (uint)!bVar89 * auVar141._4_4_;
      bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
      auVar149._8_4_ = (uint)bVar89 * auVar147._8_4_ | (uint)!bVar89 * auVar141._8_4_;
      bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
      auVar149._12_4_ = (uint)bVar89 * auVar147._12_4_ | (uint)!bVar89 * auVar141._12_4_;
      bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
      auVar149._16_4_ = (uint)bVar89 * auVar147._16_4_ | (uint)!bVar89 * auVar141._16_4_;
      bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
      auVar149._20_4_ = (uint)bVar89 * auVar147._20_4_ | (uint)!bVar89 * auVar141._20_4_;
      bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
      auVar149._24_4_ = (uint)bVar89 * auVar147._24_4_ | (uint)!bVar89 * auVar141._24_4_;
      bVar89 = SUB81(uVar90 >> 7,0);
      auVar149._28_4_ = (uint)bVar89 * auVar147._28_4_ | (uint)!bVar89 * auVar141._28_4_;
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar147 = vblendmps_avx512vl(auVar141,local_a20);
      auVar150._0_4_ =
           (uint)(bVar79 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar141._0_4_;
      bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
      auVar150._4_4_ = (uint)bVar89 * auVar147._4_4_ | (uint)!bVar89 * auVar141._4_4_;
      bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
      auVar150._8_4_ = (uint)bVar89 * auVar147._8_4_ | (uint)!bVar89 * auVar141._8_4_;
      bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
      auVar150._12_4_ = (uint)bVar89 * auVar147._12_4_ | (uint)!bVar89 * auVar141._12_4_;
      bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
      auVar150._16_4_ = (uint)bVar89 * auVar147._16_4_ | (uint)!bVar89 * auVar141._16_4_;
      bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
      auVar150._20_4_ = (uint)bVar89 * auVar147._20_4_ | (uint)!bVar89 * auVar141._20_4_;
      bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
      auVar150._24_4_ = (uint)bVar89 * auVar147._24_4_ | (uint)!bVar89 * auVar141._24_4_;
      bVar89 = SUB81(uVar90 >> 7,0);
      auVar150._28_4_ = (uint)bVar89 * auVar147._28_4_ | (uint)!bVar89 * auVar141._28_4_;
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar129,auVar141);
      local_a40 = vmaxps_avx512vl(local_5c0,auVar141);
      auVar42._8_4_ = 0x36000000;
      auVar42._0_8_ = 0x3600000036000000;
      auVar42._12_4_ = 0x36000000;
      auVar42._16_4_ = 0x36000000;
      auVar42._20_4_ = 0x36000000;
      auVar42._24_4_ = 0x36000000;
      auVar42._28_4_ = 0x36000000;
      local_900 = vmulps_avx512vl(local_a40,auVar42);
      vandps_avx512vl(auVar133,auVar141);
      uVar28 = vcmpps_avx512vl(local_900,local_900,1);
      uVar90 = uVar90 & uVar28;
      bVar86 = (byte)uVar90;
      if (bVar86 != 0) {
        uVar28 = vcmpps_avx512vl(auVar122,_DAT_01f7b000,2);
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar129 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar133 = vblendmps_avx512vl(auVar122,auVar129);
        bVar85 = (byte)uVar28;
        uVar91 = (uint)(bVar85 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar85 & 1) * local_900._0_4_;
        bVar89 = (bool)((byte)(uVar28 >> 1) & 1);
        uVar167 = (uint)bVar89 * auVar133._4_4_ | (uint)!bVar89 * local_900._4_4_;
        bVar89 = (bool)((byte)(uVar28 >> 2) & 1);
        uVar168 = (uint)bVar89 * auVar133._8_4_ | (uint)!bVar89 * local_900._8_4_;
        bVar89 = (bool)((byte)(uVar28 >> 3) & 1);
        uVar169 = (uint)bVar89 * auVar133._12_4_ | (uint)!bVar89 * local_900._12_4_;
        bVar89 = (bool)((byte)(uVar28 >> 4) & 1);
        uVar170 = (uint)bVar89 * auVar133._16_4_ | (uint)!bVar89 * local_900._16_4_;
        bVar89 = (bool)((byte)(uVar28 >> 5) & 1);
        uVar171 = (uint)bVar89 * auVar133._20_4_ | (uint)!bVar89 * local_900._20_4_;
        bVar89 = (bool)((byte)(uVar28 >> 6) & 1);
        uVar172 = (uint)bVar89 * auVar133._24_4_ | (uint)!bVar89 * local_900._24_4_;
        bVar89 = SUB81(uVar28 >> 7,0);
        uVar173 = (uint)bVar89 * auVar133._28_4_ | (uint)!bVar89 * local_900._28_4_;
        auVar149._0_4_ = (bVar86 & 1) * uVar91 | !(bool)(bVar86 & 1) * auVar149._0_4_;
        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar149._4_4_ = bVar89 * uVar167 | !bVar89 * auVar149._4_4_;
        bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar149._8_4_ = bVar89 * uVar168 | !bVar89 * auVar149._8_4_;
        bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar149._12_4_ = bVar89 * uVar169 | !bVar89 * auVar149._12_4_;
        bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar149._16_4_ = bVar89 * uVar170 | !bVar89 * auVar149._16_4_;
        bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar149._20_4_ = bVar89 * uVar171 | !bVar89 * auVar149._20_4_;
        bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar149._24_4_ = bVar89 * uVar172 | !bVar89 * auVar149._24_4_;
        bVar89 = SUB81(uVar90 >> 7,0);
        auVar149._28_4_ = bVar89 * uVar173 | !bVar89 * auVar149._28_4_;
        auVar122 = vblendmps_avx512vl(auVar129,auVar122);
        bVar89 = (bool)((byte)(uVar28 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar28 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar28 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar28 >> 6) & 1);
        bVar17 = SUB81(uVar28 >> 7,0);
        auVar150._0_4_ =
             (uint)(bVar86 & 1) *
             ((uint)(bVar85 & 1) * auVar122._0_4_ | !(bool)(bVar85 & 1) * uVar91) |
             !(bool)(bVar86 & 1) * auVar150._0_4_;
        bVar11 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar150._4_4_ =
             (uint)bVar11 * ((uint)bVar89 * auVar122._4_4_ | !bVar89 * uVar167) |
             !bVar11 * auVar150._4_4_;
        bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar150._8_4_ =
             (uint)bVar89 * ((uint)bVar12 * auVar122._8_4_ | !bVar12 * uVar168) |
             !bVar89 * auVar150._8_4_;
        bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar150._12_4_ =
             (uint)bVar89 * ((uint)bVar13 * auVar122._12_4_ | !bVar13 * uVar169) |
             !bVar89 * auVar150._12_4_;
        bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar150._16_4_ =
             (uint)bVar89 * ((uint)bVar14 * auVar122._16_4_ | !bVar14 * uVar170) |
             !bVar89 * auVar150._16_4_;
        bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar150._20_4_ =
             (uint)bVar89 * ((uint)bVar15 * auVar122._20_4_ | !bVar15 * uVar171) |
             !bVar89 * auVar150._20_4_;
        bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar150._24_4_ =
             (uint)bVar89 * ((uint)bVar16 * auVar122._24_4_ | !bVar16 * uVar172) |
             !bVar89 * auVar150._24_4_;
        bVar89 = SUB81(uVar90 >> 7,0);
        auVar150._28_4_ =
             (uint)bVar89 * ((uint)bVar17 * auVar122._28_4_ | !bVar17 * uVar173) |
             !bVar89 * auVar150._28_4_;
        bVar79 = (~bVar86 | bVar85) & bVar79;
      }
      if ((bVar79 & 0x7f) == 0) goto LAB_0194ccf8;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar129 = vxorps_avx512vl(auVar139,auVar122);
      auVar133 = vxorps_avx512vl(auVar137,auVar122);
      auVar164 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar141 = vxorps_avx512vl(auVar138,auVar122);
      auVar105 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                ZEXT416((uint)local_960._0_4_));
      auVar137 = vbroadcastss_avx512vl(auVar105);
      auVar137 = vminps_avx512vl(auVar137,auVar150);
      auVar78._4_4_ = fStack_65c;
      auVar78._0_4_ = local_660;
      auVar78._8_4_ = fStack_658;
      auVar78._12_4_ = fStack_654;
      auVar78._16_4_ = fStack_650;
      auVar78._20_4_ = fStack_64c;
      auVar78._24_4_ = fStack_648;
      auVar78._28_4_ = fStack_644;
      auVar138 = vmaxps_avx512vl(auVar78,auVar149);
      auVar139 = vmulps_avx512vl(auVar143,auVar153);
      auVar139 = vfmadd213ps_avx512vl(auVar142,auVar152,auVar139);
      auVar105 = vfmadd213ps_fma(auVar140,auVar151,auVar139);
      auVar140 = vmulps_avx512vl(auVar111,auVar153);
      auVar140 = vfmadd231ps_avx512vl(auVar140,local_6e0,auVar152);
      auVar140 = vfmadd231ps_avx512vl(auVar140,local_860,auVar151);
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar140,auVar139);
      auVar151 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar27 = vcmpps_avx512vl(auVar139,auVar151,1);
      auVar152 = vxorps_avx512vl(ZEXT1632(auVar105),auVar122);
      auVar153 = vrcp14ps_avx512vl(auVar140);
      auVar142 = vxorps_avx512vl(auVar140,auVar122);
      auVar143 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar147 = vfnmadd213ps_avx512vl(auVar153,auVar140,auVar143);
      auVar105 = vfmadd132ps_fma(auVar147,auVar153,auVar153);
      fVar253 = auVar105._0_4_ * auVar152._0_4_;
      fVar228 = auVar105._4_4_ * auVar152._4_4_;
      auVar47._4_4_ = fVar228;
      auVar47._0_4_ = fVar253;
      fVar247 = auVar105._8_4_ * auVar152._8_4_;
      auVar47._8_4_ = fVar247;
      fVar248 = auVar105._12_4_ * auVar152._12_4_;
      auVar47._12_4_ = fVar248;
      fVar249 = auVar152._16_4_ * 0.0;
      auVar47._16_4_ = fVar249;
      fVar250 = auVar152._20_4_ * 0.0;
      auVar47._20_4_ = fVar250;
      fVar251 = auVar152._24_4_ * 0.0;
      auVar47._24_4_ = fVar251;
      auVar47._28_4_ = auVar152._28_4_;
      uVar30 = vcmpps_avx512vl(auVar140,auVar142,1);
      bVar86 = (byte)uVar27 | (byte)uVar30;
      auVar147 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar148 = vblendmps_avx512vl(auVar47,auVar147);
      auVar154._0_4_ =
           (uint)(bVar86 & 1) * auVar148._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar153._0_4_;
      bVar89 = (bool)(bVar86 >> 1 & 1);
      auVar154._4_4_ = (uint)bVar89 * auVar148._4_4_ | (uint)!bVar89 * auVar153._4_4_;
      bVar89 = (bool)(bVar86 >> 2 & 1);
      auVar154._8_4_ = (uint)bVar89 * auVar148._8_4_ | (uint)!bVar89 * auVar153._8_4_;
      bVar89 = (bool)(bVar86 >> 3 & 1);
      auVar154._12_4_ = (uint)bVar89 * auVar148._12_4_ | (uint)!bVar89 * auVar153._12_4_;
      bVar89 = (bool)(bVar86 >> 4 & 1);
      auVar154._16_4_ = (uint)bVar89 * auVar148._16_4_ | (uint)!bVar89 * auVar153._16_4_;
      bVar89 = (bool)(bVar86 >> 5 & 1);
      auVar154._20_4_ = (uint)bVar89 * auVar148._20_4_ | (uint)!bVar89 * auVar153._20_4_;
      bVar89 = (bool)(bVar86 >> 6 & 1);
      auVar154._24_4_ = (uint)bVar89 * auVar148._24_4_ | (uint)!bVar89 * auVar153._24_4_;
      auVar154._28_4_ =
           (uint)(bVar86 >> 7) * auVar148._28_4_ | (uint)!(bool)(bVar86 >> 7) * auVar153._28_4_;
      auVar153 = vmaxps_avx512vl(auVar138,auVar154);
      uVar30 = vcmpps_avx512vl(auVar140,auVar142,6);
      bVar86 = (byte)uVar27 | (byte)uVar30;
      auVar155._0_4_ = (uint)(bVar86 & 1) * 0x7f800000 | (uint)!(bool)(bVar86 & 1) * (int)fVar253;
      bVar89 = (bool)(bVar86 >> 1 & 1);
      auVar155._4_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar228;
      bVar89 = (bool)(bVar86 >> 2 & 1);
      auVar155._8_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar247;
      bVar89 = (bool)(bVar86 >> 3 & 1);
      auVar155._12_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar248;
      bVar89 = (bool)(bVar86 >> 4 & 1);
      auVar155._16_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar249;
      bVar89 = (bool)(bVar86 >> 5 & 1);
      auVar155._20_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar250;
      bVar89 = (bool)(bVar86 >> 6 & 1);
      auVar155._24_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar251;
      auVar155._28_4_ =
           (uint)(bVar86 >> 7) * 0x7f800000 | (uint)!(bool)(bVar86 >> 7) * auVar152._28_4_;
      auVar140 = vminps_avx512vl(auVar137,auVar155);
      auVar105 = vxorps_avx512vl(auVar138._0_16_,auVar138._0_16_);
      auVar134 = vsubps_avx512vl(ZEXT1632(auVar105),auVar134);
      auVar135 = vsubps_avx512vl(ZEXT1632(auVar105),auVar135);
      auVar137 = ZEXT1632(auVar105);
      auVar136 = vsubps_avx512vl(auVar137,auVar136);
      auVar136 = vmulps_avx512vl(auVar136,auVar129);
      auVar135 = vfmadd231ps_avx512vl(auVar136,auVar141,auVar135);
      auVar134 = vfmadd231ps_avx512vl(auVar135,auVar133,auVar134);
      auVar129 = vmulps_avx512vl(auVar111,auVar129);
      auVar129 = vfmadd231ps_avx512vl(auVar129,local_6e0,auVar141);
      auVar129 = vfmadd231ps_avx512vl(auVar129,local_860,auVar133);
      vandps_avx512vl(auVar129,auVar139);
      uVar27 = vcmpps_avx512vl(auVar129,auVar151,1);
      auVar133 = vxorps_avx512vl(auVar134,auVar122);
      auVar141 = vrcp14ps_avx512vl(auVar129);
      auVar122 = vxorps_avx512vl(auVar129,auVar122);
      auVar292 = ZEXT3264(auVar122);
      auVar134 = vfnmadd213ps_avx512vl(auVar141,auVar129,auVar143);
      auVar105 = vfmadd132ps_fma(auVar134,auVar141,auVar141);
      fVar253 = auVar105._0_4_ * auVar133._0_4_;
      fVar228 = auVar105._4_4_ * auVar133._4_4_;
      auVar48._4_4_ = fVar228;
      auVar48._0_4_ = fVar253;
      fVar247 = auVar105._8_4_ * auVar133._8_4_;
      auVar48._8_4_ = fVar247;
      fVar248 = auVar105._12_4_ * auVar133._12_4_;
      auVar48._12_4_ = fVar248;
      fVar249 = auVar133._16_4_ * 0.0;
      auVar48._16_4_ = fVar249;
      fVar250 = auVar133._20_4_ * 0.0;
      auVar48._20_4_ = fVar250;
      fVar251 = auVar133._24_4_ * 0.0;
      auVar48._24_4_ = fVar251;
      auVar48._28_4_ = auVar133._28_4_;
      uVar30 = vcmpps_avx512vl(auVar129,auVar122,1);
      bVar86 = (byte)uVar27 | (byte)uVar30;
      auVar134 = vblendmps_avx512vl(auVar48,auVar147);
      auVar156._0_4_ =
           (uint)(bVar86 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar141._0_4_;
      bVar89 = (bool)(bVar86 >> 1 & 1);
      auVar156._4_4_ = (uint)bVar89 * auVar134._4_4_ | (uint)!bVar89 * auVar141._4_4_;
      bVar89 = (bool)(bVar86 >> 2 & 1);
      auVar156._8_4_ = (uint)bVar89 * auVar134._8_4_ | (uint)!bVar89 * auVar141._8_4_;
      bVar89 = (bool)(bVar86 >> 3 & 1);
      auVar156._12_4_ = (uint)bVar89 * auVar134._12_4_ | (uint)!bVar89 * auVar141._12_4_;
      bVar89 = (bool)(bVar86 >> 4 & 1);
      auVar156._16_4_ = (uint)bVar89 * auVar134._16_4_ | (uint)!bVar89 * auVar141._16_4_;
      bVar89 = (bool)(bVar86 >> 5 & 1);
      auVar156._20_4_ = (uint)bVar89 * auVar134._20_4_ | (uint)!bVar89 * auVar141._20_4_;
      bVar89 = (bool)(bVar86 >> 6 & 1);
      auVar156._24_4_ = (uint)bVar89 * auVar134._24_4_ | (uint)!bVar89 * auVar141._24_4_;
      auVar156._28_4_ =
           (uint)(bVar86 >> 7) * auVar134._28_4_ | (uint)!(bool)(bVar86 >> 7) * auVar141._28_4_;
      local_840 = vmaxps_avx(auVar153,auVar156);
      auVar192 = ZEXT3264(local_840);
      uVar30 = vcmpps_avx512vl(auVar129,auVar122,6);
      bVar86 = (byte)uVar27 | (byte)uVar30;
      auVar157._0_4_ = (uint)(bVar86 & 1) * 0x7f800000 | (uint)!(bool)(bVar86 & 1) * (int)fVar253;
      bVar89 = (bool)(bVar86 >> 1 & 1);
      auVar157._4_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar228;
      bVar89 = (bool)(bVar86 >> 2 & 1);
      auVar157._8_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar247;
      bVar89 = (bool)(bVar86 >> 3 & 1);
      auVar157._12_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar248;
      bVar89 = (bool)(bVar86 >> 4 & 1);
      auVar157._16_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar249;
      bVar89 = (bool)(bVar86 >> 5 & 1);
      auVar157._20_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar250;
      bVar89 = (bool)(bVar86 >> 6 & 1);
      auVar157._24_4_ = (uint)bVar89 * 0x7f800000 | (uint)!bVar89 * (int)fVar251;
      auVar157._28_4_ =
           (uint)(bVar86 >> 7) * 0x7f800000 | (uint)!(bool)(bVar86 >> 7) * auVar133._28_4_;
      local_6a0 = vminps_avx(auVar140,auVar157);
      uVar27 = vcmpps_avx512vl(local_840,local_6a0,2);
      bVar79 = bVar79 & 0x7f & (byte)uVar27;
      if (bVar79 == 0) goto LAB_0194ccf8;
      auVar122 = vmaxps_avx512vl(auVar137,auVar123);
      auVar123 = vfmadd213ps_avx512vl(local_aa0,auVar145,auVar128);
      fVar253 = auVar125._0_4_;
      fVar228 = auVar125._4_4_;
      auVar49._4_4_ = fVar228 * auVar123._4_4_;
      auVar49._0_4_ = fVar253 * auVar123._0_4_;
      fVar247 = auVar125._8_4_;
      auVar49._8_4_ = fVar247 * auVar123._8_4_;
      fVar248 = auVar125._12_4_;
      auVar49._12_4_ = fVar248 * auVar123._12_4_;
      fVar249 = auVar125._16_4_;
      auVar49._16_4_ = fVar249 * auVar123._16_4_;
      fVar250 = auVar125._20_4_;
      auVar49._20_4_ = fVar250 * auVar123._20_4_;
      fVar251 = auVar125._24_4_;
      auVar49._24_4_ = fVar251 * auVar123._24_4_;
      auVar49._28_4_ = auVar123._28_4_;
      auVar123 = vfmadd213ps_avx512vl(local_a20,auVar145,auVar128);
      auVar50._4_4_ = fVar228 * auVar123._4_4_;
      auVar50._0_4_ = fVar253 * auVar123._0_4_;
      auVar50._8_4_ = fVar247 * auVar123._8_4_;
      auVar50._12_4_ = fVar248 * auVar123._12_4_;
      auVar50._16_4_ = fVar249 * auVar123._16_4_;
      auVar50._20_4_ = fVar250 * auVar123._20_4_;
      auVar50._24_4_ = fVar251 * auVar123._24_4_;
      auVar50._28_4_ = auVar123._28_4_;
      auVar123 = vminps_avx512vl(auVar49,auVar143);
      auVar129 = ZEXT832(0) << 0x20;
      auVar123 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
      auVar133 = vminps_avx512vl(auVar50,auVar143);
      auVar51._4_4_ = (auVar123._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar123._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar123._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar123._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar123._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar123._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar123._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar123._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar51,auVar183,auVar261);
      auVar123 = vmaxps_avx(auVar133,ZEXT832(0) << 0x20);
      auVar52._4_4_ = (auVar123._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar123._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar123._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar123._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar123._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar123._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar123._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar123._28_4_ + 7.0;
      local_500 = vfmadd213ps_avx512vl(auVar52,auVar183,auVar261);
      auVar53._4_4_ = auVar122._4_4_ * auVar122._4_4_;
      auVar53._0_4_ = auVar122._0_4_ * auVar122._0_4_;
      auVar53._8_4_ = auVar122._8_4_ * auVar122._8_4_;
      auVar53._12_4_ = auVar122._12_4_ * auVar122._12_4_;
      auVar53._16_4_ = auVar122._16_4_ * auVar122._16_4_;
      auVar53._20_4_ = auVar122._20_4_ * auVar122._20_4_;
      auVar53._24_4_ = auVar122._24_4_ * auVar122._24_4_;
      auVar53._28_4_ = auVar122._28_4_;
      auVar123 = vsubps_avx(auVar144,auVar53);
      auVar54._4_4_ = auVar123._4_4_ * (float)local_880._4_4_;
      auVar54._0_4_ = auVar123._0_4_ * (float)local_880._0_4_;
      auVar54._8_4_ = auVar123._8_4_ * fStack_878;
      auVar54._12_4_ = auVar123._12_4_ * fStack_874;
      auVar54._16_4_ = auVar123._16_4_ * fStack_870;
      auVar54._20_4_ = auVar123._20_4_ * fStack_86c;
      auVar54._24_4_ = auVar123._24_4_ * fStack_868;
      auVar54._28_4_ = auVar122._28_4_;
      auVar122 = vsubps_avx(local_a80,auVar54);
      uVar27 = vcmpps_avx512vl(auVar122,ZEXT832(0) << 0x20,5);
      bVar86 = (byte)uVar27;
      if (bVar86 == 0) {
        bVar86 = 0;
        auVar126 = ZEXT832(0) << 0x20;
        auVar124 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar122 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar133 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar192 = ZEXT864(0) << 0x20;
        auVar158._8_4_ = 0x7f800000;
        auVar158._0_8_ = 0x7f8000007f800000;
        auVar158._12_4_ = 0x7f800000;
        auVar158._16_4_ = 0x7f800000;
        auVar158._20_4_ = 0x7f800000;
        auVar158._24_4_ = 0x7f800000;
        auVar158._28_4_ = 0x7f800000;
        auVar159._8_4_ = 0xff800000;
        auVar159._0_8_ = 0xff800000ff800000;
        auVar159._12_4_ = 0xff800000;
        auVar159._16_4_ = 0xff800000;
        auVar159._20_4_ = 0xff800000;
        auVar159._24_4_ = 0xff800000;
        auVar159._28_4_ = 0xff800000;
      }
      else {
        auVar109 = vxorps_avx512vl(auVar176,auVar176);
        uVar90 = vcmpps_avx512vl(auVar122,auVar137,5);
        auVar122 = vsqrtps_avx(auVar122);
        auVar129 = vfnmadd213ps_avx512vl(local_8a0,local_8c0,auVar143);
        auVar105 = vfmadd132ps_fma(auVar129,local_8c0,local_8c0);
        auVar129 = vsubps_avx(local_8e0,auVar122);
        auVar55._4_4_ = auVar105._4_4_ * auVar129._4_4_;
        auVar55._0_4_ = auVar105._0_4_ * auVar129._0_4_;
        auVar55._8_4_ = auVar105._8_4_ * auVar129._8_4_;
        auVar55._12_4_ = auVar105._12_4_ * auVar129._12_4_;
        auVar55._16_4_ = auVar129._16_4_ * 0.0;
        auVar55._20_4_ = auVar129._20_4_ * 0.0;
        auVar55._24_4_ = auVar129._24_4_ * 0.0;
        auVar55._28_4_ = 0x3e000000;
        auVar122 = vsubps_avx512vl(auVar122,auVar146);
        auVar56._4_4_ = auVar105._4_4_ * auVar122._4_4_;
        auVar56._0_4_ = auVar105._0_4_ * auVar122._0_4_;
        auVar56._8_4_ = auVar105._8_4_ * auVar122._8_4_;
        auVar56._12_4_ = auVar105._12_4_ * auVar122._12_4_;
        auVar56._16_4_ = auVar122._16_4_ * 0.0;
        auVar56._20_4_ = auVar122._20_4_ * 0.0;
        auVar56._24_4_ = auVar122._24_4_ * 0.0;
        auVar56._28_4_ = uVar193;
        auVar122 = vfmadd213ps_avx512vl(auVar145,auVar55,auVar128);
        auVar291._0_4_ = fVar253 * auVar122._0_4_;
        auVar291._4_4_ = fVar228 * auVar122._4_4_;
        auVar291._8_4_ = fVar247 * auVar122._8_4_;
        auVar291._12_4_ = fVar248 * auVar122._12_4_;
        auVar291._16_4_ = fVar249 * auVar122._16_4_;
        auVar291._20_4_ = fVar250 * auVar122._20_4_;
        auVar291._24_4_ = fVar251 * auVar122._24_4_;
        auVar291._28_4_ = 0;
        auVar122 = vmulps_avx512vl(local_860,auVar55);
        auVar129 = vmulps_avx512vl(local_6e0,auVar55);
        auVar140 = vmulps_avx512vl(auVar111,auVar55);
        auVar133 = vfmadd213ps_avx512vl(auVar126,auVar291,auVar130);
        auVar122 = vsubps_avx512vl(auVar122,auVar133);
        auVar133 = vfmadd213ps_avx512vl(auVar124,auVar291,auVar131);
        auVar133 = vsubps_avx512vl(auVar129,auVar133);
        auVar105 = vfmadd213ps_fma(auVar291,auVar127,auVar132);
        auVar129 = vsubps_avx(auVar140,ZEXT1632(auVar105));
        auVar192 = ZEXT3264(auVar129);
        auVar128 = vfmadd213ps_avx512vl(auVar145,auVar56,auVar128);
        auVar125 = vmulps_avx512vl(auVar125,auVar128);
        auVar128 = vmulps_avx512vl(local_860,auVar56);
        auVar140 = vmulps_avx512vl(local_6e0,auVar56);
        auVar141 = vmulps_avx512vl(auVar111,auVar56);
        auVar105 = vfmadd213ps_fma(auVar126,auVar125,auVar130);
        auVar129 = vsubps_avx(auVar128,ZEXT1632(auVar105));
        auVar105 = vfmadd213ps_fma(auVar124,auVar125,auVar131);
        auVar126 = vsubps_avx512vl(auVar140,ZEXT1632(auVar105));
        auVar105 = vfmadd213ps_fma(auVar127,auVar125,auVar132);
        auVar124 = vsubps_avx512vl(auVar141,ZEXT1632(auVar105));
        auVar184._8_4_ = 0x7f800000;
        auVar184._0_8_ = 0x7f8000007f800000;
        auVar184._12_4_ = 0x7f800000;
        auVar184._16_4_ = 0x7f800000;
        auVar184._20_4_ = 0x7f800000;
        auVar184._24_4_ = 0x7f800000;
        auVar184._28_4_ = 0x7f800000;
        auVar127 = vblendmps_avx512vl(auVar184,auVar55);
        bVar89 = (bool)((byte)uVar90 & 1);
        auVar158._0_4_ = (uint)bVar89 * auVar127._0_4_ | (uint)!bVar89 * auVar130._0_4_;
        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar158._4_4_ = (uint)bVar89 * auVar127._4_4_ | (uint)!bVar89 * auVar130._4_4_;
        bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar158._8_4_ = (uint)bVar89 * auVar127._8_4_ | (uint)!bVar89 * auVar130._8_4_;
        bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar158._12_4_ = (uint)bVar89 * auVar127._12_4_ | (uint)!bVar89 * auVar130._12_4_;
        bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar158._16_4_ = (uint)bVar89 * auVar127._16_4_ | (uint)!bVar89 * auVar130._16_4_;
        bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar158._20_4_ = (uint)bVar89 * auVar127._20_4_ | (uint)!bVar89 * auVar130._20_4_;
        bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar158._24_4_ = (uint)bVar89 * auVar127._24_4_ | (uint)!bVar89 * auVar130._24_4_;
        bVar89 = SUB81(uVar90 >> 7,0);
        auVar158._28_4_ = (uint)bVar89 * auVar127._28_4_ | (uint)!bVar89 * auVar130._28_4_;
        auVar185._8_4_ = 0xff800000;
        auVar185._0_8_ = 0xff800000ff800000;
        auVar185._12_4_ = 0xff800000;
        auVar185._16_4_ = 0xff800000;
        auVar185._20_4_ = 0xff800000;
        auVar185._24_4_ = 0xff800000;
        auVar185._28_4_ = 0xff800000;
        auVar127 = vblendmps_avx512vl(auVar185,auVar56);
        bVar89 = (bool)((byte)uVar90 & 1);
        auVar159._0_4_ = (uint)bVar89 * auVar127._0_4_ | (uint)!bVar89 * -0x800000;
        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar159._4_4_ = (uint)bVar89 * auVar127._4_4_ | (uint)!bVar89 * -0x800000;
        bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar159._8_4_ = (uint)bVar89 * auVar127._8_4_ | (uint)!bVar89 * -0x800000;
        bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar159._12_4_ = (uint)bVar89 * auVar127._12_4_ | (uint)!bVar89 * -0x800000;
        bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar159._16_4_ = (uint)bVar89 * auVar127._16_4_ | (uint)!bVar89 * -0x800000;
        bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar159._20_4_ = (uint)bVar89 * auVar127._20_4_ | (uint)!bVar89 * -0x800000;
        bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar159._24_4_ = (uint)bVar89 * auVar127._24_4_ | (uint)!bVar89 * -0x800000;
        bVar89 = SUB81(uVar90 >> 7,0);
        auVar159._28_4_ = (uint)bVar89 * auVar127._28_4_ | (uint)!bVar89 * -0x800000;
        auVar43._8_4_ = 0x36000000;
        auVar43._0_8_ = 0x3600000036000000;
        auVar43._12_4_ = 0x36000000;
        auVar43._16_4_ = 0x36000000;
        auVar43._20_4_ = 0x36000000;
        auVar43._24_4_ = 0x36000000;
        auVar43._28_4_ = 0x36000000;
        auVar127 = vmulps_avx512vl(local_a40,auVar43);
        uVar28 = vcmpps_avx512vl(auVar127,local_900,0xe);
        uVar90 = uVar90 & uVar28;
        bVar85 = (byte)uVar90;
        if (bVar85 != 0) {
          uVar28 = vcmpps_avx512vl(auVar123,ZEXT1632(auVar109),2);
          auVar284._8_4_ = 0x7f800000;
          auVar284._0_8_ = 0x7f8000007f800000;
          auVar284._12_4_ = 0x7f800000;
          auVar284._16_4_ = 0x7f800000;
          auVar284._20_4_ = 0x7f800000;
          auVar284._24_4_ = 0x7f800000;
          auVar284._28_4_ = 0x7f800000;
          auVar295._8_4_ = 0xff800000;
          auVar295._0_8_ = 0xff800000ff800000;
          auVar295._12_4_ = 0xff800000;
          auVar295._16_4_ = 0xff800000;
          auVar295._20_4_ = 0xff800000;
          auVar295._24_4_ = 0xff800000;
          auVar295._28_4_ = 0xff800000;
          auVar123 = vblendmps_avx512vl(auVar284,auVar295);
          bVar80 = (byte)uVar28;
          uVar91 = (uint)(bVar80 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar127._0_4_;
          bVar89 = (bool)((byte)(uVar28 >> 1) & 1);
          uVar167 = (uint)bVar89 * auVar123._4_4_ | (uint)!bVar89 * auVar127._4_4_;
          bVar89 = (bool)((byte)(uVar28 >> 2) & 1);
          uVar168 = (uint)bVar89 * auVar123._8_4_ | (uint)!bVar89 * auVar127._8_4_;
          bVar89 = (bool)((byte)(uVar28 >> 3) & 1);
          uVar169 = (uint)bVar89 * auVar123._12_4_ | (uint)!bVar89 * auVar127._12_4_;
          bVar89 = (bool)((byte)(uVar28 >> 4) & 1);
          uVar170 = (uint)bVar89 * auVar123._16_4_ | (uint)!bVar89 * auVar127._16_4_;
          bVar89 = (bool)((byte)(uVar28 >> 5) & 1);
          uVar171 = (uint)bVar89 * auVar123._20_4_ | (uint)!bVar89 * auVar127._20_4_;
          bVar89 = (bool)((byte)(uVar28 >> 6) & 1);
          uVar172 = (uint)bVar89 * auVar123._24_4_ | (uint)!bVar89 * auVar127._24_4_;
          bVar89 = SUB81(uVar28 >> 7,0);
          uVar173 = (uint)bVar89 * auVar123._28_4_ | (uint)!bVar89 * auVar127._28_4_;
          auVar158._0_4_ = (bVar85 & 1) * uVar91 | !(bool)(bVar85 & 1) * auVar158._0_4_;
          bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
          auVar158._4_4_ = bVar89 * uVar167 | !bVar89 * auVar158._4_4_;
          bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
          auVar158._8_4_ = bVar89 * uVar168 | !bVar89 * auVar158._8_4_;
          bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
          auVar158._12_4_ = bVar89 * uVar169 | !bVar89 * auVar158._12_4_;
          bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
          auVar158._16_4_ = bVar89 * uVar170 | !bVar89 * auVar158._16_4_;
          bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
          auVar158._20_4_ = bVar89 * uVar171 | !bVar89 * auVar158._20_4_;
          bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
          auVar158._24_4_ = bVar89 * uVar172 | !bVar89 * auVar158._24_4_;
          bVar89 = SUB81(uVar90 >> 7,0);
          auVar158._28_4_ = bVar89 * uVar173 | !bVar89 * auVar158._28_4_;
          auVar123 = vblendmps_avx512vl(auVar295,auVar284);
          bVar89 = (bool)((byte)(uVar28 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar28 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
          bVar15 = (bool)((byte)(uVar28 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar28 >> 6) & 1);
          bVar17 = SUB81(uVar28 >> 7,0);
          auVar159._0_4_ =
               (uint)(bVar85 & 1) *
               ((uint)(bVar80 & 1) * auVar123._0_4_ | !(bool)(bVar80 & 1) * uVar91) |
               !(bool)(bVar85 & 1) * auVar159._0_4_;
          bVar11 = (bool)((byte)(uVar90 >> 1) & 1);
          auVar159._4_4_ =
               (uint)bVar11 * ((uint)bVar89 * auVar123._4_4_ | !bVar89 * uVar167) |
               !bVar11 * auVar159._4_4_;
          bVar89 = (bool)((byte)(uVar90 >> 2) & 1);
          auVar159._8_4_ =
               (uint)bVar89 * ((uint)bVar12 * auVar123._8_4_ | !bVar12 * uVar168) |
               !bVar89 * auVar159._8_4_;
          bVar89 = (bool)((byte)(uVar90 >> 3) & 1);
          auVar159._12_4_ =
               (uint)bVar89 * ((uint)bVar13 * auVar123._12_4_ | !bVar13 * uVar169) |
               !bVar89 * auVar159._12_4_;
          bVar89 = (bool)((byte)(uVar90 >> 4) & 1);
          auVar159._16_4_ =
               (uint)bVar89 * ((uint)bVar14 * auVar123._16_4_ | !bVar14 * uVar170) |
               !bVar89 * auVar159._16_4_;
          bVar89 = (bool)((byte)(uVar90 >> 5) & 1);
          auVar159._20_4_ =
               (uint)bVar89 * ((uint)bVar15 * auVar123._20_4_ | !bVar15 * uVar171) |
               !bVar89 * auVar159._20_4_;
          bVar89 = (bool)((byte)(uVar90 >> 6) & 1);
          auVar159._24_4_ =
               (uint)bVar89 * ((uint)bVar16 * auVar123._24_4_ | !bVar16 * uVar172) |
               !bVar89 * auVar159._24_4_;
          bVar89 = SUB81(uVar90 >> 7,0);
          auVar159._28_4_ =
               (uint)bVar89 * ((uint)bVar17 * auVar123._28_4_ | !bVar17 * uVar173) |
               !bVar89 * auVar159._28_4_;
          bVar86 = (~bVar85 | bVar80) & bVar86;
        }
      }
      auVar123 = vmulps_avx512vl(auVar111,auVar124);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_6e0,auVar126);
      auVar285 = ZEXT3264(local_6e0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_860,auVar129);
      auVar292 = ZEXT3264(local_840);
      _local_540 = local_840;
      local_520 = vminps_avx(local_6a0,auVar158);
      auVar279._8_4_ = 0x7fffffff;
      auVar279._0_8_ = 0x7fffffff7fffffff;
      auVar279._12_4_ = 0x7fffffff;
      auVar279._16_4_ = 0x7fffffff;
      auVar279._20_4_ = 0x7fffffff;
      auVar279._24_4_ = 0x7fffffff;
      auVar279._28_4_ = 0x7fffffff;
      auVar280 = ZEXT3264(auVar279);
      auVar123 = vandps_avx(auVar123,auVar279);
      _local_760 = vmaxps_avx(local_840,auVar159);
      auVar270._8_4_ = 0x3e99999a;
      auVar270._0_8_ = 0x3e99999a3e99999a;
      auVar270._12_4_ = 0x3e99999a;
      auVar270._16_4_ = 0x3e99999a;
      auVar270._20_4_ = 0x3e99999a;
      auVar270._24_4_ = 0x3e99999a;
      auVar270._28_4_ = 0x3e99999a;
      uVar27 = vcmpps_avx512vl(auVar123,auVar270,1);
      uVar30 = vcmpps_avx512vl(local_840,local_520,2);
      bVar85 = (byte)uVar30 & bVar79;
      uVar29 = vcmpps_avx512vl(_local_760,local_6a0,2);
      if ((bVar79 & ((byte)uVar29 | (byte)uVar30)) != 0) {
        bVar80 = (byte)uVar27 | ~bVar86;
        auVar123 = vmulps_avx512vl(auVar111,auVar192._0_32_);
        auVar105 = vfmadd213ps_fma(auVar133,local_6e0,auVar123);
        auVar123 = vfmadd213ps_avx512vl(auVar122,local_860,ZEXT1632(auVar105));
        auVar123 = vandps_avx(auVar123,auVar279);
        uVar27 = vcmpps_avx512vl(auVar123,auVar270,1);
        bVar86 = (byte)uVar27 | ~bVar86;
        auVar186._8_4_ = 2;
        auVar186._0_8_ = 0x200000002;
        auVar186._12_4_ = 2;
        auVar186._16_4_ = 2;
        auVar186._20_4_ = 2;
        auVar186._24_4_ = 2;
        auVar186._28_4_ = 2;
        auVar44._8_4_ = 3;
        auVar44._0_8_ = 0x300000003;
        auVar44._12_4_ = 3;
        auVar44._16_4_ = 3;
        auVar44._20_4_ = 3;
        auVar44._24_4_ = 3;
        auVar44._28_4_ = 3;
        auVar123 = vpblendmd_avx512vl(auVar186,auVar44);
        local_680._0_4_ = (uint)(bVar86 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar86 & 1) * 2;
        bVar89 = (bool)(bVar86 >> 1 & 1);
        local_680._4_4_ = (uint)bVar89 * auVar123._4_4_ | (uint)!bVar89 * 2;
        bVar89 = (bool)(bVar86 >> 2 & 1);
        local_680._8_4_ = (uint)bVar89 * auVar123._8_4_ | (uint)!bVar89 * 2;
        bVar89 = (bool)(bVar86 >> 3 & 1);
        local_680._12_4_ = (uint)bVar89 * auVar123._12_4_ | (uint)!bVar89 * 2;
        bVar89 = (bool)(bVar86 >> 4 & 1);
        local_680._16_4_ = (uint)bVar89 * auVar123._16_4_ | (uint)!bVar89 * 2;
        bVar89 = (bool)(bVar86 >> 5 & 1);
        local_680._20_4_ = (uint)bVar89 * auVar123._20_4_ | (uint)!bVar89 * 2;
        bVar89 = (bool)(bVar86 >> 6 & 1);
        local_680._24_4_ = (uint)bVar89 * auVar123._24_4_ | (uint)!bVar89 * 2;
        local_680._28_4_ = (uint)(bVar86 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar86 >> 7) * 2;
        local_700 = vpbroadcastd_avx512vl();
        uVar27 = vpcmpd_avx512vl(local_700,local_680,5);
        bVar86 = (byte)uVar27 & bVar85;
        local_740 = local_840._0_4_ + (float)local_820._0_4_;
        fStack_73c = local_840._4_4_ + (float)local_820._4_4_;
        fStack_738 = local_840._8_4_ + fStack_818;
        fStack_734 = local_840._12_4_ + fStack_814;
        fStack_730 = local_840._16_4_ + fStack_810;
        fStack_72c = local_840._20_4_ + fStack_80c;
        fStack_728 = local_840._24_4_ + fStack_808;
        fStack_724 = local_840._28_4_ + fStack_804;
        _local_6c0 = _local_760;
        while( true ) {
          if (bVar86 == 0) break;
          auVar187._8_4_ = 0x7f800000;
          auVar187._0_8_ = 0x7f8000007f800000;
          auVar187._12_4_ = 0x7f800000;
          auVar187._16_4_ = 0x7f800000;
          auVar187._20_4_ = 0x7f800000;
          auVar187._24_4_ = 0x7f800000;
          auVar187._28_4_ = 0x7f800000;
          auVar123 = vblendmps_avx512vl(auVar187,local_840);
          auVar160._0_4_ =
               (uint)(bVar86 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 1 & 1);
          auVar160._4_4_ = (uint)bVar89 * auVar123._4_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 2 & 1);
          auVar160._8_4_ = (uint)bVar89 * auVar123._8_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 3 & 1);
          auVar160._12_4_ = (uint)bVar89 * auVar123._12_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 4 & 1);
          auVar160._16_4_ = (uint)bVar89 * auVar123._16_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 5 & 1);
          auVar160._20_4_ = (uint)bVar89 * auVar123._20_4_ | (uint)!bVar89 * 0x7f800000;
          auVar160._24_4_ =
               (uint)(bVar86 >> 6) * auVar123._24_4_ | (uint)!(bool)(bVar86 >> 6) * 0x7f800000;
          auVar160._28_4_ = 0x7f800000;
          auVar123 = vshufps_avx(auVar160,auVar160,0xb1);
          auVar123 = vminps_avx(auVar160,auVar123);
          auVar122 = vshufpd_avx(auVar123,auVar123,5);
          auVar123 = vminps_avx(auVar123,auVar122);
          auVar122 = vpermpd_avx2(auVar123,0x4e);
          auVar123 = vminps_avx(auVar123,auVar122);
          uVar27 = vcmpps_avx512vl(auVar160,auVar123,0);
          bVar81 = (byte)uVar27 & bVar86;
          bVar82 = bVar86;
          if (bVar81 != 0) {
            bVar82 = bVar81;
          }
          iVar31 = 0;
          for (uVar91 = (uint)bVar82; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
            iVar31 = iVar31 + 1;
          }
          uVar91 = *(uint *)(local_4e0 + (uint)(iVar31 << 2));
          uVar167 = *(uint *)(local_540 + (uint)(iVar31 << 2));
          fVar253 = auVar108._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar285 = ZEXT1664(auVar285._0_16_);
            auVar192 = ZEXT1664(auVar192._0_16_);
            auVar292 = ZEXT1664(auVar292._0_16_);
            fVar253 = sqrtf((float)local_a00._0_4_);
          }
          auVar280 = ZEXT464(uVar167);
          auVar109 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar105 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar2 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar110 = vminps_avx(auVar109,auVar2);
          auVar109 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar2 = vmaxps_avx(auVar105,auVar109);
          auVar230._8_4_ = 0x7fffffff;
          auVar230._0_8_ = 0x7fffffff7fffffff;
          auVar230._12_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar110,auVar230);
          auVar109 = vandps_avx(auVar2,auVar230);
          auVar105 = vmaxps_avx(auVar105,auVar109);
          auVar109 = vmovshdup_avx(auVar105);
          auVar109 = vmaxss_avx(auVar109,auVar105);
          auVar105 = vshufpd_avx(auVar105,auVar105,1);
          auVar105 = vmaxss_avx(auVar105,auVar109);
          fVar228 = auVar105._0_4_ * 1.9073486e-06;
          local_950 = vshufps_avx(auVar2,auVar2,0xff);
          auVar105 = vinsertps_avx(ZEXT416(uVar167),ZEXT416(uVar91),0x10);
          auVar164 = ZEXT1664(auVar105);
          lVar83 = 5;
          do {
            do {
              bVar89 = lVar83 == 0;
              lVar83 = lVar83 + -1;
              if (bVar89) goto LAB_0194d8ac;
              uVar193 = auVar164._0_4_;
              auVar177._4_4_ = uVar193;
              auVar177._0_4_ = uVar193;
              auVar177._8_4_ = uVar193;
              auVar177._12_4_ = uVar193;
              auVar105 = vfmadd132ps_fma(auVar177,ZEXT816(0) << 0x40,local_9f0);
              auVar109 = vmovshdup_avx(auVar164._0_16_);
              fVar271 = auVar109._0_4_;
              fVar252 = 1.0 - fVar271;
              fVar247 = fVar271 * fVar271;
              auVar97 = SUB6416(ZEXT464(0x40400000),0);
              auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar110 = vfmadd213ss_fma(auVar97,auVar109,auVar96);
              auVar2 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar247),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar103 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar252),auVar96);
              auVar103 = vfmadd213ss_fma(auVar103,ZEXT416((uint)(fVar252 * fVar252)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar248 = fVar252 * fVar252 * -fVar271 * 0.5;
              fVar249 = auVar2._0_4_ * 0.5;
              fVar250 = auVar103._0_4_ * 0.5;
              fVar251 = fVar271 * fVar271 * -fVar252 * 0.5;
              auVar231._0_4_ = fVar251 * (float)local_9e0._0_4_;
              auVar231._4_4_ = fVar251 * (float)local_9e0._4_4_;
              auVar231._8_4_ = fVar251 * fStack_9d8;
              auVar231._12_4_ = fVar251 * fStack_9d4;
              auVar257._4_4_ = fVar250;
              auVar257._0_4_ = fVar250;
              auVar257._8_4_ = fVar250;
              auVar257._12_4_ = fVar250;
              auVar2 = vfmadd132ps_fma(auVar257,auVar231,local_9a0._0_16_);
              auVar214._4_4_ = fVar249;
              auVar214._0_4_ = fVar249;
              auVar214._8_4_ = fVar249;
              auVar214._12_4_ = fVar249;
              auVar2 = vfmadd132ps_fma(auVar214,auVar2,local_9c0._0_16_);
              auVar232._4_4_ = fVar248;
              auVar232._0_4_ = fVar248;
              auVar232._8_4_ = fVar248;
              auVar232._12_4_ = fVar248;
              auVar2 = vfmadd132ps_fma(auVar232,auVar2,local_980._0_16_);
              auVar103 = vfmadd231ss_fma(auVar96,auVar109,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar103;
              auVar103 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar109,ZEXT416(0x40800000)
                                        );
              local_8c0._0_16_ = auVar103;
              auVar103 = vfmadd213ss_fma(auVar97,auVar109,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar103;
              _local_880 = auVar2;
              auVar2 = vsubps_avx(auVar105,auVar2);
              auVar105 = vdpps_avx(auVar2,auVar2,0x7f);
              fVar248 = auVar105._0_4_;
              local_800 = auVar164;
              if (fVar248 < 0.0) {
                local_a80._0_4_ = auVar110._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar252);
                local_a20._0_4_ = fVar247;
                local_a40._0_4_ = fVar252 * -2.0;
                auVar285._0_4_ = sqrtf(fVar248);
                auVar285._4_60_ = extraout_var;
                auVar110 = ZEXT416((uint)local_a80._0_4_);
                auVar103 = auVar285._0_16_;
                auVar96 = local_aa0._0_16_;
              }
              else {
                auVar103 = vsqrtss_avx(auVar105,auVar105);
                local_a40._0_4_ = fVar252 * -2.0;
                local_a20._0_4_ = fVar247;
                auVar96 = ZEXT416((uint)fVar252);
              }
              fVar247 = auVar96._0_4_;
              auVar98 = vfnmadd231ss_fma(ZEXT416((uint)(fVar271 * (fVar247 + fVar247))),auVar96,
                                         auVar96);
              auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar271 + fVar271)),
                                         ZEXT416((uint)(fVar271 * fVar271 * 3.0)));
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * fVar247 * -3.0)),
                                        ZEXT416((uint)(fVar247 + fVar247)),auVar96);
              auVar96 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar109,
                                        ZEXT416((uint)local_a20._0_4_));
              fVar247 = auVar98._0_4_ * 0.5;
              fVar249 = auVar110._0_4_ * 0.5;
              fVar250 = auVar97._0_4_ * 0.5;
              fVar251 = auVar96._0_4_ * 0.5;
              auVar233._0_4_ = fVar251 * (float)local_9e0._0_4_;
              auVar233._4_4_ = fVar251 * (float)local_9e0._4_4_;
              auVar233._8_4_ = fVar251 * fStack_9d8;
              auVar233._12_4_ = fVar251 * fStack_9d4;
              auVar215._4_4_ = fVar250;
              auVar215._0_4_ = fVar250;
              auVar215._8_4_ = fVar250;
              auVar215._12_4_ = fVar250;
              auVar110 = vfmadd132ps_fma(auVar215,auVar233,local_9a0._0_16_);
              auVar196._4_4_ = fVar249;
              auVar196._0_4_ = fVar249;
              auVar196._8_4_ = fVar249;
              auVar196._12_4_ = fVar249;
              auVar110 = vfmadd132ps_fma(auVar196,auVar110,local_9c0._0_16_);
              auVar293._4_4_ = fVar247;
              auVar293._0_4_ = fVar247;
              auVar293._8_4_ = fVar247;
              auVar293._12_4_ = fVar247;
              local_a80._0_16_ = vfmadd132ps_fma(auVar293,auVar110,local_980._0_16_);
              local_a20._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar57._12_4_ = 0;
              auVar57._0_12_ = ZEXT812(0);
              fVar247 = local_a20._0_4_;
              auVar110 = vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar247));
              fVar249 = auVar110._0_4_;
              local_a40._0_16_ = vrcp14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar247));
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar96 = vxorps_avx512vl(local_a20._0_16_,auVar32);
              auVar110 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                          SUB6416(ZEXT464(0x40000000),0));
              local_900._0_4_ = auVar110._0_4_;
              local_aa0._0_4_ = auVar103._0_4_;
              if (fVar247 < auVar96._0_4_) {
                fVar250 = sqrtf(fVar247);
                auVar103 = ZEXT416((uint)local_aa0._0_4_);
                auVar110 = local_a80._0_16_;
              }
              else {
                auVar110 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                fVar250 = auVar110._0_4_;
                auVar110 = local_a80._0_16_;
              }
              fVar247 = fVar249 * 1.5 + fVar247 * -0.5 * fVar249 * fVar249 * fVar249;
              auVar258._0_4_ = auVar110._0_4_ * fVar247;
              auVar258._4_4_ = auVar110._4_4_ * fVar247;
              auVar258._8_4_ = auVar110._8_4_ * fVar247;
              auVar258._12_4_ = auVar110._12_4_ * fVar247;
              auVar96 = vdpps_avx(auVar2,auVar258,0x7f);
              fVar252 = auVar103._0_4_;
              fVar249 = auVar96._0_4_;
              auVar178._0_4_ = fVar249 * fVar249;
              auVar178._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar178._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar178._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar97 = vsubps_avx512vl(auVar105,auVar178);
              fVar251 = auVar97._0_4_;
              auVar197._4_12_ = ZEXT812(0) << 0x20;
              auVar197._0_4_ = fVar251;
              auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              auVar99 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
              if (fVar251 < 0.0) {
                local_940 = fVar247;
                fStack_93c = fVar247;
                fStack_938 = fVar247;
                fStack_934 = fVar247;
                local_930 = auVar258;
                local_920 = auVar98;
                fVar251 = sqrtf(fVar251);
                auVar99 = ZEXT416(auVar99._0_4_);
                auVar103 = ZEXT416((uint)local_aa0._0_4_);
                auVar258 = local_930;
                auVar97 = local_920;
                auVar110 = local_a80._0_16_;
                fVar247 = local_940;
                fVar271 = fStack_93c;
                fVar272 = fStack_938;
                fVar273 = fStack_934;
              }
              else {
                auVar97 = vsqrtss_avx(auVar97,auVar97);
                fVar251 = auVar97._0_4_;
                auVar97 = auVar98;
                fVar271 = fVar247;
                fVar272 = fVar247;
                fVar273 = fVar247;
              }
              auVar192 = ZEXT1664(auVar2);
              auVar198._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar198._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar198._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar198._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar216._4_4_ = local_8c0._0_4_;
              auVar216._0_4_ = local_8c0._0_4_;
              auVar216._8_4_ = local_8c0._0_4_;
              auVar216._12_4_ = local_8c0._0_4_;
              auVar100 = vfmadd132ps_fma(auVar216,auVar198,local_9a0._0_16_);
              auVar199._4_4_ = local_8a0._0_4_;
              auVar199._0_4_ = local_8a0._0_4_;
              auVar199._8_4_ = local_8a0._0_4_;
              auVar199._12_4_ = local_8a0._0_4_;
              auVar100 = vfmadd132ps_fma(auVar199,auVar100,local_9c0._0_16_);
              auVar109 = vfmadd213ss_fma(auVar109,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000)
                                        );
              uVar193 = auVar109._0_4_;
              auVar217._4_4_ = uVar193;
              auVar217._0_4_ = uVar193;
              auVar217._8_4_ = uVar193;
              auVar217._12_4_ = uVar193;
              auVar109 = vfmadd132ps_fma(auVar217,auVar100,local_980._0_16_);
              auVar200._0_4_ = auVar109._0_4_ * (float)local_a20._0_4_;
              auVar200._4_4_ = auVar109._4_4_ * (float)local_a20._0_4_;
              auVar200._8_4_ = auVar109._8_4_ * (float)local_a20._0_4_;
              auVar200._12_4_ = auVar109._12_4_ * (float)local_a20._0_4_;
              auVar109 = vdpps_avx(auVar110,auVar109,0x7f);
              fVar211 = auVar109._0_4_;
              auVar218._0_4_ = auVar110._0_4_ * fVar211;
              auVar218._4_4_ = auVar110._4_4_ * fVar211;
              auVar218._8_4_ = auVar110._8_4_ * fVar211;
              auVar218._12_4_ = auVar110._12_4_ * fVar211;
              auVar109 = vsubps_avx(auVar200,auVar218);
              fVar211 = (float)local_900._0_4_ * (float)local_a40._0_4_;
              auVar100 = vmaxss_avx(ZEXT416((uint)fVar228),
                                    ZEXT416((uint)(local_800._0_4_ * fVar253 * 1.9073486e-06)));
              auVar33._8_4_ = 0x80000000;
              auVar33._0_8_ = 0x8000000080000000;
              auVar33._12_4_ = 0x80000000;
              auVar165._16_48_ = local_800._16_48_;
              auVar102 = vxorps_avx512vl(auVar110,auVar33);
              auVar219._0_4_ = fVar247 * auVar109._0_4_ * fVar211;
              auVar219._4_4_ = fVar271 * auVar109._4_4_ * fVar211;
              auVar219._8_4_ = fVar272 * auVar109._8_4_ * fVar211;
              auVar219._12_4_ = fVar273 * auVar109._12_4_ * fVar211;
              auVar109 = vdpps_avx(auVar102,auVar258,0x7f);
              auVar101 = vfmadd213ss_fma(auVar103,ZEXT416((uint)fVar228),auVar100);
              auVar103 = vdpps_avx(auVar2,auVar219,0x7f);
              auVar101 = vfmadd213ss_fma(ZEXT416((uint)(fVar252 + 1.0)),
                                         ZEXT416((uint)(fVar228 / fVar250)),auVar101);
              fVar247 = auVar109._0_4_ + auVar103._0_4_;
              auVar292 = ZEXT464((uint)fVar247);
              auVar109 = vdpps_avx(local_9f0,auVar258,0x7f);
              auVar103 = vdpps_avx(auVar2,auVar102,0x7f);
              auVar99 = vmulss_avx512f(auVar99,auVar97);
              fVar250 = auVar98._0_4_ * 1.5 + auVar99._0_4_ * auVar97._0_4_ * auVar97._0_4_;
              auVar97 = vdpps_avx(auVar2,local_9f0,0x7f);
              auVar99 = vfnmadd231ss_fma(auVar103,auVar96,ZEXT416((uint)fVar247));
              auVar97 = vfnmadd231ss_fma(auVar97,auVar96,auVar109);
              auVar103 = vpermilps_avx(_local_880,0xff);
              fVar251 = fVar251 - auVar103._0_4_;
              auVar98 = vshufps_avx(auVar110,auVar110,0xff);
              auVar103 = vfmsub213ss_fma(auVar99,ZEXT416((uint)fVar250),auVar98);
              auVar282._8_4_ = 0x80000000;
              auVar282._0_8_ = 0x8000000080000000;
              auVar282._12_4_ = 0x80000000;
              auVar285 = ZEXT1664(auVar282);
              auVar277._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar277._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar277._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar280 = ZEXT1664(auVar277);
              auVar97 = ZEXT416((uint)(auVar97._0_4_ * fVar250));
              auVar99 = vfmsub231ss_fma(ZEXT416((uint)(auVar109._0_4_ * auVar103._0_4_)),
                                        ZEXT416((uint)fVar247),auVar97);
              auVar103 = vinsertps_avx(auVar277,auVar97,0x1c);
              auVar263._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
              auVar263._8_4_ = auVar109._8_4_ ^ 0x80000000;
              auVar263._12_4_ = auVar109._12_4_ ^ 0x80000000;
              auVar97 = vinsertps_avx(ZEXT416((uint)fVar247),auVar263,0x10);
              auVar234._0_4_ = auVar99._0_4_;
              auVar234._4_4_ = auVar234._0_4_;
              auVar234._8_4_ = auVar234._0_4_;
              auVar234._12_4_ = auVar234._0_4_;
              auVar109 = vdivps_avx(auVar103,auVar234);
              auVar103 = vdivps_avx(auVar97,auVar234);
              auVar235._0_4_ = fVar249 * auVar109._0_4_ + fVar251 * auVar103._0_4_;
              auVar235._4_4_ = fVar249 * auVar109._4_4_ + fVar251 * auVar103._4_4_;
              auVar235._8_4_ = fVar249 * auVar109._8_4_ + fVar251 * auVar103._8_4_;
              auVar235._12_4_ = fVar249 * auVar109._12_4_ + fVar251 * auVar103._12_4_;
              auVar109 = vsubps_avx(local_800._0_16_,auVar235);
              auVar164 = ZEXT1664(auVar109);
              auVar34._8_4_ = 0x7fffffff;
              auVar34._0_8_ = 0x7fffffff7fffffff;
              auVar34._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar96,auVar34);
            } while (auVar101._0_4_ <= auVar103._0_4_);
            auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar101._0_4_ + auVar100._0_4_)),local_950,
                                       ZEXT416(0x36000000));
            auVar35._8_4_ = 0x7fffffff;
            auVar35._0_8_ = 0x7fffffff7fffffff;
            auVar35._12_4_ = 0x7fffffff;
            auVar96 = vandps_avx512vl(ZEXT416((uint)fVar251),auVar35);
          } while (auVar103._0_4_ <= auVar96._0_4_);
          fVar253 = auVar109._0_4_ + (float)local_960._0_4_;
          if (fVar24 <= fVar253) {
            fVar228 = *(float *)(ray + k * 4 + 0x200);
            if (fVar253 <= fVar228) {
              auVar109 = vmovshdup_avx(auVar109);
              fVar249 = auVar109._0_4_;
              if ((0.0 <= fVar249) && (fVar249 <= 1.0)) {
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT412(0);
                auVar165._4_12_ = ZEXT412(0);
                auVar165._0_4_ = fVar248;
                auVar109 = vrsqrt14ss_avx512f(auVar58 << 0x20,auVar165._0_16_);
                fVar248 = auVar109._0_4_;
                auVar105 = vmulss_avx512f(auVar105,ZEXT416(0xbf000000));
                pGVar5 = (context->scene->geometries).items[uVar3].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar248 = fVar248 * 1.5 + auVar105._0_4_ * fVar248 * fVar248 * fVar248;
                  auVar236._0_4_ = auVar2._0_4_ * fVar248;
                  auVar236._4_4_ = auVar2._4_4_ * fVar248;
                  auVar236._8_4_ = auVar2._8_4_ * fVar248;
                  auVar236._12_4_ = auVar2._12_4_ * fVar248;
                  auVar103 = vfmadd213ps_fma(auVar98,auVar236,auVar110);
                  auVar105 = vshufps_avx(auVar236,auVar236,0xc9);
                  auVar109 = vshufps_avx(auVar110,auVar110,0xc9);
                  auVar237._0_4_ = auVar236._0_4_ * auVar109._0_4_;
                  auVar237._4_4_ = auVar236._4_4_ * auVar109._4_4_;
                  auVar237._8_4_ = auVar236._8_4_ * auVar109._8_4_;
                  auVar237._12_4_ = auVar236._12_4_ * auVar109._12_4_;
                  auVar110 = vfmsub231ps_fma(auVar237,auVar110,auVar105);
                  auVar105 = vshufps_avx(auVar110,auVar110,0xc9);
                  auVar109 = vshufps_avx(auVar103,auVar103,0xc9);
                  auVar110 = vshufps_avx(auVar110,auVar110,0xd2);
                  auVar179._0_4_ = auVar103._0_4_ * auVar110._0_4_;
                  auVar179._4_4_ = auVar103._4_4_ * auVar110._4_4_;
                  auVar179._8_4_ = auVar103._8_4_ * auVar110._8_4_;
                  auVar179._12_4_ = auVar103._12_4_ * auVar110._12_4_;
                  auVar105 = vfmsub231ps_fma(auVar179,auVar105,auVar109);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar253;
                    uVar193 = vextractps_avx(auVar105,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar193;
                    uVar193 = vextractps_avx(auVar105,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar193;
                    *(int *)(ray + k * 4 + 0x380) = auVar105._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar249;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar4;
                    *(uint *)(ray + k * 4 + 0x480) = uVar3;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auVar267 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar267,auVar164);
                    auVar164 = vpermps_avx512f(auVar267,ZEXT1664(auVar105));
                    auVar267 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar267,ZEXT1664(auVar105));
                    local_380 = vbroadcastss_avx512f(auVar105);
                    local_400[0] = (RTCHitN)auVar164[0];
                    local_400[1] = (RTCHitN)auVar164[1];
                    local_400[2] = (RTCHitN)auVar164[2];
                    local_400[3] = (RTCHitN)auVar164[3];
                    local_400[4] = (RTCHitN)auVar164[4];
                    local_400[5] = (RTCHitN)auVar164[5];
                    local_400[6] = (RTCHitN)auVar164[6];
                    local_400[7] = (RTCHitN)auVar164[7];
                    local_400[8] = (RTCHitN)auVar164[8];
                    local_400[9] = (RTCHitN)auVar164[9];
                    local_400[10] = (RTCHitN)auVar164[10];
                    local_400[0xb] = (RTCHitN)auVar164[0xb];
                    local_400[0xc] = (RTCHitN)auVar164[0xc];
                    local_400[0xd] = (RTCHitN)auVar164[0xd];
                    local_400[0xe] = (RTCHitN)auVar164[0xe];
                    local_400[0xf] = (RTCHitN)auVar164[0xf];
                    local_400[0x10] = (RTCHitN)auVar164[0x10];
                    local_400[0x11] = (RTCHitN)auVar164[0x11];
                    local_400[0x12] = (RTCHitN)auVar164[0x12];
                    local_400[0x13] = (RTCHitN)auVar164[0x13];
                    local_400[0x14] = (RTCHitN)auVar164[0x14];
                    local_400[0x15] = (RTCHitN)auVar164[0x15];
                    local_400[0x16] = (RTCHitN)auVar164[0x16];
                    local_400[0x17] = (RTCHitN)auVar164[0x17];
                    local_400[0x18] = (RTCHitN)auVar164[0x18];
                    local_400[0x19] = (RTCHitN)auVar164[0x19];
                    local_400[0x1a] = (RTCHitN)auVar164[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar164[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar164[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar164[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar164[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar164[0x1f];
                    local_400[0x20] = (RTCHitN)auVar164[0x20];
                    local_400[0x21] = (RTCHitN)auVar164[0x21];
                    local_400[0x22] = (RTCHitN)auVar164[0x22];
                    local_400[0x23] = (RTCHitN)auVar164[0x23];
                    local_400[0x24] = (RTCHitN)auVar164[0x24];
                    local_400[0x25] = (RTCHitN)auVar164[0x25];
                    local_400[0x26] = (RTCHitN)auVar164[0x26];
                    local_400[0x27] = (RTCHitN)auVar164[0x27];
                    local_400[0x28] = (RTCHitN)auVar164[0x28];
                    local_400[0x29] = (RTCHitN)auVar164[0x29];
                    local_400[0x2a] = (RTCHitN)auVar164[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar164[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar164[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar164[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar164[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar164[0x2f];
                    local_400[0x30] = (RTCHitN)auVar164[0x30];
                    local_400[0x31] = (RTCHitN)auVar164[0x31];
                    local_400[0x32] = (RTCHitN)auVar164[0x32];
                    local_400[0x33] = (RTCHitN)auVar164[0x33];
                    local_400[0x34] = (RTCHitN)auVar164[0x34];
                    local_400[0x35] = (RTCHitN)auVar164[0x35];
                    local_400[0x36] = (RTCHitN)auVar164[0x36];
                    local_400[0x37] = (RTCHitN)auVar164[0x37];
                    local_400[0x38] = (RTCHitN)auVar164[0x38];
                    local_400[0x39] = (RTCHitN)auVar164[0x39];
                    local_400[0x3a] = (RTCHitN)auVar164[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar164[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar164[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar164[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar164[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar164[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar164 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar164);
                    auVar123 = vpcmpeqd_avx2(auVar164._0_32_,auVar164._0_32_);
                    local_a48[3] = auVar123;
                    local_a48[2] = auVar123;
                    local_a48[1] = auVar123;
                    *local_a48 = auVar123;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar253;
                    auVar164 = vmovdqa64_avx512f(local_4c0);
                    local_7c0 = vmovdqa64_avx512f(auVar164);
                    local_ad0.valid = (int *)local_7c0;
                    local_ad0.geometryUserPtr = pGVar5->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_400;
                    local_ad0.N = 0x10;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar280 = ZEXT1664(auVar277);
                      auVar285 = ZEXT1664(auVar282);
                      auVar192 = ZEXT1664(auVar2);
                      auVar292 = ZEXT1664(ZEXT416((uint)fVar247));
                      (*pGVar5->intersectionFilterN)(&local_ad0);
                      auVar164 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar27 = vptestmd_avx512f(auVar164,auVar164);
                    if ((short)uVar27 != 0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar280 = ZEXT1664(auVar280._0_16_);
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar192 = ZEXT1664(auVar192._0_16_);
                        auVar292 = ZEXT1664(auVar292._0_16_);
                        (*p_Var10)(&local_ad0);
                        auVar164 = vmovdqa64_avx512f(local_7c0);
                      }
                      uVar90 = vptestmd_avx512f(auVar164,auVar164);
                      if ((short)uVar90 != 0) {
                        iVar61 = *(int *)(local_ad0.hit + 4);
                        iVar62 = *(int *)(local_ad0.hit + 8);
                        iVar63 = *(int *)(local_ad0.hit + 0xc);
                        iVar64 = *(int *)(local_ad0.hit + 0x10);
                        iVar65 = *(int *)(local_ad0.hit + 0x14);
                        iVar66 = *(int *)(local_ad0.hit + 0x18);
                        iVar67 = *(int *)(local_ad0.hit + 0x1c);
                        iVar68 = *(int *)(local_ad0.hit + 0x20);
                        iVar69 = *(int *)(local_ad0.hit + 0x24);
                        iVar70 = *(int *)(local_ad0.hit + 0x28);
                        iVar71 = *(int *)(local_ad0.hit + 0x2c);
                        iVar72 = *(int *)(local_ad0.hit + 0x30);
                        iVar73 = *(int *)(local_ad0.hit + 0x34);
                        iVar74 = *(int *)(local_ad0.hit + 0x38);
                        iVar75 = *(int *)(local_ad0.hit + 0x3c);
                        bVar82 = (byte)uVar90;
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar81 = (byte)(uVar90 >> 8);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x300) =
                             (uint)(bVar82 & 1) * *(int *)local_ad0.hit |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x300);
                        *(uint *)(local_ad0.ray + 0x304) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x304)
                        ;
                        *(uint *)(local_ad0.ray + 0x308) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x308)
                        ;
                        *(uint *)(local_ad0.ray + 0x30c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x30c)
                        ;
                        *(uint *)(local_ad0.ray + 0x310) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x310)
                        ;
                        *(uint *)(local_ad0.ray + 0x314) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x314)
                        ;
                        *(uint *)(local_ad0.ray + 0x318) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x318)
                        ;
                        *(uint *)(local_ad0.ray + 0x31c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x31c)
                        ;
                        *(uint *)(local_ad0.ray + 800) =
                             (uint)(bVar81 & 1) * iVar68 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 800);
                        *(uint *)(local_ad0.ray + 0x324) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x324)
                        ;
                        *(uint *)(local_ad0.ray + 0x328) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x328)
                        ;
                        *(uint *)(local_ad0.ray + 0x32c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x32c)
                        ;
                        *(uint *)(local_ad0.ray + 0x330) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x330)
                        ;
                        *(uint *)(local_ad0.ray + 0x334) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x334)
                        ;
                        *(uint *)(local_ad0.ray + 0x338) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x338)
                        ;
                        *(uint *)(local_ad0.ray + 0x33c) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x33c)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0x44);
                        iVar62 = *(int *)(local_ad0.hit + 0x48);
                        iVar63 = *(int *)(local_ad0.hit + 0x4c);
                        iVar64 = *(int *)(local_ad0.hit + 0x50);
                        iVar65 = *(int *)(local_ad0.hit + 0x54);
                        iVar66 = *(int *)(local_ad0.hit + 0x58);
                        iVar67 = *(int *)(local_ad0.hit + 0x5c);
                        iVar68 = *(int *)(local_ad0.hit + 0x60);
                        iVar69 = *(int *)(local_ad0.hit + 100);
                        iVar70 = *(int *)(local_ad0.hit + 0x68);
                        iVar71 = *(int *)(local_ad0.hit + 0x6c);
                        iVar72 = *(int *)(local_ad0.hit + 0x70);
                        iVar73 = *(int *)(local_ad0.hit + 0x74);
                        iVar74 = *(int *)(local_ad0.hit + 0x78);
                        iVar75 = *(int *)(local_ad0.hit + 0x7c);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x340) =
                             (uint)(bVar82 & 1) * *(int *)(local_ad0.hit + 0x40) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x340);
                        *(uint *)(local_ad0.ray + 0x344) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x344)
                        ;
                        *(uint *)(local_ad0.ray + 0x348) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x348)
                        ;
                        *(uint *)(local_ad0.ray + 0x34c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x34c)
                        ;
                        *(uint *)(local_ad0.ray + 0x350) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x350)
                        ;
                        *(uint *)(local_ad0.ray + 0x354) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x354)
                        ;
                        *(uint *)(local_ad0.ray + 0x358) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x358)
                        ;
                        *(uint *)(local_ad0.ray + 0x35c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x35c)
                        ;
                        *(uint *)(local_ad0.ray + 0x360) =
                             (uint)(bVar81 & 1) * iVar68 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x360);
                        *(uint *)(local_ad0.ray + 0x364) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x364)
                        ;
                        *(uint *)(local_ad0.ray + 0x368) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x368)
                        ;
                        *(uint *)(local_ad0.ray + 0x36c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x36c)
                        ;
                        *(uint *)(local_ad0.ray + 0x370) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x370)
                        ;
                        *(uint *)(local_ad0.ray + 0x374) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x374)
                        ;
                        *(uint *)(local_ad0.ray + 0x378) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x378)
                        ;
                        *(uint *)(local_ad0.ray + 0x37c) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x37c)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0x84);
                        iVar62 = *(int *)(local_ad0.hit + 0x88);
                        iVar63 = *(int *)(local_ad0.hit + 0x8c);
                        iVar64 = *(int *)(local_ad0.hit + 0x90);
                        iVar65 = *(int *)(local_ad0.hit + 0x94);
                        iVar66 = *(int *)(local_ad0.hit + 0x98);
                        iVar67 = *(int *)(local_ad0.hit + 0x9c);
                        iVar68 = *(int *)(local_ad0.hit + 0xa0);
                        iVar69 = *(int *)(local_ad0.hit + 0xa4);
                        iVar70 = *(int *)(local_ad0.hit + 0xa8);
                        iVar71 = *(int *)(local_ad0.hit + 0xac);
                        iVar72 = *(int *)(local_ad0.hit + 0xb0);
                        iVar73 = *(int *)(local_ad0.hit + 0xb4);
                        iVar74 = *(int *)(local_ad0.hit + 0xb8);
                        iVar75 = *(int *)(local_ad0.hit + 0xbc);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x380) =
                             (uint)(bVar82 & 1) * *(int *)(local_ad0.hit + 0x80) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x380);
                        *(uint *)(local_ad0.ray + 900) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 900);
                        *(uint *)(local_ad0.ray + 0x388) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x388)
                        ;
                        *(uint *)(local_ad0.ray + 0x38c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x38c)
                        ;
                        *(uint *)(local_ad0.ray + 0x390) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x390)
                        ;
                        *(uint *)(local_ad0.ray + 0x394) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x394)
                        ;
                        *(uint *)(local_ad0.ray + 0x398) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x398)
                        ;
                        *(uint *)(local_ad0.ray + 0x39c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x39c)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a0) =
                             (uint)(bVar81 & 1) * iVar68 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                        *(uint *)(local_ad0.ray + 0x3a4) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3a4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a8) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3a8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3ac) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3ac)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b0) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x3b0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b4) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x3b4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b8) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x3b8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3bc) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x3bc)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0xc4);
                        iVar62 = *(int *)(local_ad0.hit + 200);
                        iVar63 = *(int *)(local_ad0.hit + 0xcc);
                        iVar64 = *(int *)(local_ad0.hit + 0xd0);
                        iVar65 = *(int *)(local_ad0.hit + 0xd4);
                        iVar66 = *(int *)(local_ad0.hit + 0xd8);
                        iVar67 = *(int *)(local_ad0.hit + 0xdc);
                        iVar68 = *(int *)(local_ad0.hit + 0xe0);
                        iVar69 = *(int *)(local_ad0.hit + 0xe4);
                        iVar70 = *(int *)(local_ad0.hit + 0xe8);
                        iVar71 = *(int *)(local_ad0.hit + 0xec);
                        iVar72 = *(int *)(local_ad0.hit + 0xf0);
                        iVar73 = *(int *)(local_ad0.hit + 0xf4);
                        iVar74 = *(int *)(local_ad0.hit + 0xf8);
                        iVar75 = *(int *)(local_ad0.hit + 0xfc);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x3c0) =
                             (uint)(bVar82 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                        *(uint *)(local_ad0.ray + 0x3c4) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x3c4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3c8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3c8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3cc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3cc)
                        ;
                        *(uint *)(local_ad0.ray + 0x3d0) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3d0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3d4) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3d4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3d8) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3d8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3dc) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3dc)
                        ;
                        *(uint *)(local_ad0.ray + 0x3e0) =
                             (uint)(bVar81 & 1) * iVar68 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                        *(uint *)(local_ad0.ray + 0x3e4) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3e4)
                        ;
                        *(uint *)(local_ad0.ray + 1000) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 1000);
                        *(uint *)(local_ad0.ray + 0x3ec) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3ec)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f0) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x3f0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f4) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x3f4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f8) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x3f8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3fc) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x3fc)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0x104);
                        iVar62 = *(int *)(local_ad0.hit + 0x108);
                        iVar63 = *(int *)(local_ad0.hit + 0x10c);
                        iVar64 = *(int *)(local_ad0.hit + 0x110);
                        iVar65 = *(int *)(local_ad0.hit + 0x114);
                        iVar66 = *(int *)(local_ad0.hit + 0x118);
                        iVar67 = *(int *)(local_ad0.hit + 0x11c);
                        iVar68 = *(int *)(local_ad0.hit + 0x120);
                        iVar69 = *(int *)(local_ad0.hit + 0x124);
                        iVar70 = *(int *)(local_ad0.hit + 0x128);
                        iVar71 = *(int *)(local_ad0.hit + 300);
                        iVar72 = *(int *)(local_ad0.hit + 0x130);
                        iVar73 = *(int *)(local_ad0.hit + 0x134);
                        iVar74 = *(int *)(local_ad0.hit + 0x138);
                        iVar75 = *(int *)(local_ad0.hit + 0x13c);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x400) =
                             (uint)(bVar82 & 1) * *(int *)(local_ad0.hit + 0x100) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x400);
                        *(uint *)(local_ad0.ray + 0x404) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x404)
                        ;
                        *(uint *)(local_ad0.ray + 0x408) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x408)
                        ;
                        *(uint *)(local_ad0.ray + 0x40c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x40c)
                        ;
                        *(uint *)(local_ad0.ray + 0x410) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x410)
                        ;
                        *(uint *)(local_ad0.ray + 0x414) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x414)
                        ;
                        *(uint *)(local_ad0.ray + 0x418) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x418)
                        ;
                        *(uint *)(local_ad0.ray + 0x41c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x41c)
                        ;
                        *(uint *)(local_ad0.ray + 0x420) =
                             (uint)(bVar81 & 1) * iVar68 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x420);
                        *(uint *)(local_ad0.ray + 0x424) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x424)
                        ;
                        *(uint *)(local_ad0.ray + 0x428) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x428)
                        ;
                        *(uint *)(local_ad0.ray + 0x42c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x42c)
                        ;
                        *(uint *)(local_ad0.ray + 0x430) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x430)
                        ;
                        *(uint *)(local_ad0.ray + 0x434) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x434)
                        ;
                        *(uint *)(local_ad0.ray + 0x438) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x438)
                        ;
                        *(uint *)(local_ad0.ray + 0x43c) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x43c)
                        ;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                        auVar164 = vmovdqu32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar164;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                        auVar164 = vmovdqu32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar164;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                        auVar164 = vmovdqa32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar164;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                        auVar164 = vmovdqa32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar164;
                        goto LAB_0194d8ac;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar228;
                  }
                }
              }
            }
          }
LAB_0194d8ac:
          uVar193 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar265._4_4_ = uVar193;
          auVar265._0_4_ = uVar193;
          auVar265._8_4_ = uVar193;
          auVar265._12_4_ = uVar193;
          auVar265._16_4_ = uVar193;
          auVar265._20_4_ = uVar193;
          auVar265._24_4_ = uVar193;
          auVar265._28_4_ = uVar193;
          auVar164 = ZEXT3264(auVar265);
          auVar76._4_4_ = fStack_73c;
          auVar76._0_4_ = local_740;
          auVar76._8_4_ = fStack_738;
          auVar76._12_4_ = fStack_734;
          auVar76._16_4_ = fStack_730;
          auVar76._20_4_ = fStack_72c;
          auVar76._24_4_ = fStack_728;
          auVar76._28_4_ = fStack_724;
          uVar27 = vcmpps_avx512vl(auVar265,auVar76,0xd);
          bVar86 = ~('\x01' << ((byte)iVar31 & 0x1f)) & bVar86 & (byte)uVar27;
        }
        auVar188._0_4_ = (float)local_820._0_4_ + (float)local_760._0_4_;
        auVar188._4_4_ = (float)local_820._4_4_ + (float)local_760._4_4_;
        auVar188._8_4_ = fStack_818 + fStack_758;
        auVar188._12_4_ = fStack_814 + fStack_754;
        auVar188._16_4_ = fStack_810 + fStack_750;
        auVar188._20_4_ = fStack_80c + fStack_74c;
        auVar188._24_4_ = fStack_808 + fStack_748;
        auVar188._28_4_ = fStack_804 + fStack_744;
        uVar193 = auVar164._0_4_;
        auVar207._4_4_ = uVar193;
        auVar207._0_4_ = uVar193;
        auVar207._8_4_ = uVar193;
        auVar207._12_4_ = uVar193;
        auVar207._16_4_ = uVar193;
        auVar207._20_4_ = uVar193;
        auVar207._24_4_ = uVar193;
        auVar207._28_4_ = uVar193;
        uVar27 = vcmpps_avx512vl(auVar188,auVar207,2);
        auVar189._8_4_ = 2;
        auVar189._0_8_ = 0x200000002;
        auVar189._12_4_ = 2;
        auVar189._16_4_ = 2;
        auVar189._20_4_ = 2;
        auVar189._24_4_ = 2;
        auVar189._28_4_ = 2;
        auVar45._8_4_ = 3;
        auVar45._0_8_ = 0x300000003;
        auVar45._12_4_ = 3;
        auVar45._16_4_ = 3;
        auVar45._20_4_ = 3;
        auVar45._24_4_ = 3;
        auVar45._28_4_ = 3;
        auVar123 = vpblendmd_avx512vl(auVar189,auVar45);
        local_760._0_4_ = (uint)(bVar80 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar89 = (bool)(bVar80 >> 1 & 1);
        local_760._4_4_ = (uint)bVar89 * auVar123._4_4_ | (uint)!bVar89 * 2;
        bVar89 = (bool)(bVar80 >> 2 & 1);
        fStack_758 = (float)((uint)bVar89 * auVar123._8_4_ | (uint)!bVar89 * 2);
        bVar89 = (bool)(bVar80 >> 3 & 1);
        fStack_754 = (float)((uint)bVar89 * auVar123._12_4_ | (uint)!bVar89 * 2);
        bVar89 = (bool)(bVar80 >> 4 & 1);
        fStack_750 = (float)((uint)bVar89 * auVar123._16_4_ | (uint)!bVar89 * 2);
        bVar89 = (bool)(bVar80 >> 5 & 1);
        fStack_74c = (float)((uint)bVar89 * auVar123._20_4_ | (uint)!bVar89 * 2);
        bVar89 = (bool)(bVar80 >> 6 & 1);
        fStack_748 = (float)((uint)bVar89 * auVar123._24_4_ | (uint)!bVar89 * 2);
        fStack_744 = (float)((uint)(bVar80 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2)
        ;
        bVar79 = (byte)uVar29 & bVar79 & (byte)uVar27;
        uVar27 = vpcmpd_avx512vl(_local_760,local_700,2);
        bVar86 = (byte)uVar27 & bVar79;
        local_840 = _local_6c0;
        local_740 = (float)local_820._0_4_ + (float)local_6c0._0_4_;
        fStack_73c = (float)local_820._4_4_ + (float)local_6c0._4_4_;
        fStack_738 = fStack_818 + fStack_6b8;
        fStack_734 = fStack_814 + fStack_6b4;
        fStack_730 = fStack_810 + fStack_6b0;
        fStack_72c = fStack_80c + fStack_6ac;
        fStack_728 = fStack_808 + fStack_6a8;
        fStack_724 = fStack_804 + fStack_6a4;
        while( true ) {
          if (bVar86 == 0) break;
          auVar190._8_4_ = 0x7f800000;
          auVar190._0_8_ = 0x7f8000007f800000;
          auVar190._12_4_ = 0x7f800000;
          auVar190._16_4_ = 0x7f800000;
          auVar190._20_4_ = 0x7f800000;
          auVar190._24_4_ = 0x7f800000;
          auVar190._28_4_ = 0x7f800000;
          auVar123 = vblendmps_avx512vl(auVar190,local_840);
          auVar161._0_4_ =
               (uint)(bVar86 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 1 & 1);
          auVar161._4_4_ = (uint)bVar89 * auVar123._4_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 2 & 1);
          auVar161._8_4_ = (uint)bVar89 * auVar123._8_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 3 & 1);
          auVar161._12_4_ = (uint)bVar89 * auVar123._12_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 4 & 1);
          auVar161._16_4_ = (uint)bVar89 * auVar123._16_4_ | (uint)!bVar89 * 0x7f800000;
          bVar89 = (bool)(bVar86 >> 5 & 1);
          auVar161._20_4_ = (uint)bVar89 * auVar123._20_4_ | (uint)!bVar89 * 0x7f800000;
          auVar161._24_4_ =
               (uint)(bVar86 >> 6) * auVar123._24_4_ | (uint)!(bool)(bVar86 >> 6) * 0x7f800000;
          auVar161._28_4_ = 0x7f800000;
          auVar123 = vshufps_avx(auVar161,auVar161,0xb1);
          auVar123 = vminps_avx(auVar161,auVar123);
          auVar122 = vshufpd_avx(auVar123,auVar123,5);
          auVar123 = vminps_avx(auVar123,auVar122);
          auVar122 = vpermpd_avx2(auVar123,0x4e);
          auVar123 = vminps_avx(auVar123,auVar122);
          uVar27 = vcmpps_avx512vl(auVar161,auVar123,0);
          bVar82 = (byte)uVar27 & bVar86;
          bVar80 = bVar86;
          if (bVar82 != 0) {
            bVar80 = bVar82;
          }
          iVar31 = 0;
          for (uVar91 = (uint)bVar80; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
            iVar31 = iVar31 + 1;
          }
          uVar91 = *(uint *)(local_500 + (uint)(iVar31 << 2));
          uVar167 = *(uint *)(local_6a0 + (uint)(iVar31 << 2));
          fVar253 = auVar104._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar285 = ZEXT1664(auVar285._0_16_);
            auVar192 = ZEXT1664(auVar192._0_16_);
            auVar292 = ZEXT1664(auVar292._0_16_);
            fVar253 = sqrtf((float)local_a00._0_4_);
          }
          auVar280 = ZEXT464(uVar167);
          auVar109 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar105 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar2 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar110 = vminps_avx(auVar109,auVar2);
          auVar109 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar2 = vmaxps_avx(auVar105,auVar109);
          auVar238._8_4_ = 0x7fffffff;
          auVar238._0_8_ = 0x7fffffff7fffffff;
          auVar238._12_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar110,auVar238);
          auVar109 = vandps_avx(auVar2,auVar238);
          auVar105 = vmaxps_avx(auVar105,auVar109);
          auVar109 = vmovshdup_avx(auVar105);
          auVar109 = vmaxss_avx(auVar109,auVar105);
          auVar105 = vshufpd_avx(auVar105,auVar105,1);
          auVar105 = vmaxss_avx(auVar105,auVar109);
          fVar228 = auVar105._0_4_ * 1.9073486e-06;
          local_950 = vshufps_avx(auVar2,auVar2,0xff);
          auVar105 = vinsertps_avx(ZEXT416(uVar167),ZEXT416(uVar91),0x10);
          auVar164 = ZEXT1664(auVar105);
          lVar83 = 5;
          do {
            do {
              bVar89 = lVar83 == 0;
              lVar83 = lVar83 + -1;
              if (bVar89) goto LAB_0194e5ff;
              uVar193 = auVar164._0_4_;
              auVar180._4_4_ = uVar193;
              auVar180._0_4_ = uVar193;
              auVar180._8_4_ = uVar193;
              auVar180._12_4_ = uVar193;
              auVar105 = vfmadd132ps_fma(auVar180,ZEXT816(0) << 0x40,local_9f0);
              auVar109 = vmovshdup_avx(auVar164._0_16_);
              fVar271 = auVar109._0_4_;
              fVar252 = 1.0 - fVar271;
              fVar247 = fVar271 * fVar271;
              auVar97 = SUB6416(ZEXT464(0x40400000),0);
              auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar110 = vfmadd213ss_fma(auVar97,auVar109,auVar96);
              auVar2 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar247),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar103 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar252),auVar96);
              auVar103 = vfmadd213ss_fma(auVar103,ZEXT416((uint)(fVar252 * fVar252)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar248 = fVar252 * fVar252 * -fVar271 * 0.5;
              fVar249 = auVar2._0_4_ * 0.5;
              fVar250 = auVar103._0_4_ * 0.5;
              fVar251 = fVar271 * fVar271 * -fVar252 * 0.5;
              auVar239._0_4_ = fVar251 * (float)local_9e0._0_4_;
              auVar239._4_4_ = fVar251 * (float)local_9e0._4_4_;
              auVar239._8_4_ = fVar251 * fStack_9d8;
              auVar239._12_4_ = fVar251 * fStack_9d4;
              auVar259._4_4_ = fVar250;
              auVar259._0_4_ = fVar250;
              auVar259._8_4_ = fVar250;
              auVar259._12_4_ = fVar250;
              auVar2 = vfmadd132ps_fma(auVar259,auVar239,local_9a0._0_16_);
              auVar220._4_4_ = fVar249;
              auVar220._0_4_ = fVar249;
              auVar220._8_4_ = fVar249;
              auVar220._12_4_ = fVar249;
              auVar2 = vfmadd132ps_fma(auVar220,auVar2,local_9c0._0_16_);
              auVar240._4_4_ = fVar248;
              auVar240._0_4_ = fVar248;
              auVar240._8_4_ = fVar248;
              auVar240._12_4_ = fVar248;
              auVar2 = vfmadd132ps_fma(auVar240,auVar2,local_980._0_16_);
              auVar103 = vfmadd231ss_fma(auVar96,auVar109,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar103;
              auVar103 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar109,ZEXT416(0x40800000)
                                        );
              local_8c0._0_16_ = auVar103;
              auVar103 = vfmadd213ss_fma(auVar97,auVar109,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar103;
              _local_880 = auVar2;
              auVar2 = vsubps_avx(auVar105,auVar2);
              auVar105 = vdpps_avx(auVar2,auVar2,0x7f);
              fVar248 = auVar105._0_4_;
              local_800 = auVar164;
              if (fVar248 < 0.0) {
                local_a80._0_4_ = auVar110._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar252);
                local_a20._0_4_ = fVar247;
                local_a40._0_4_ = fVar252 * -2.0;
                auVar192._0_4_ = sqrtf(fVar248);
                auVar192._4_60_ = extraout_var_00;
                auVar110 = ZEXT416((uint)local_a80._0_4_);
                auVar103 = auVar192._0_16_;
                auVar96 = local_aa0._0_16_;
              }
              else {
                auVar103 = vsqrtss_avx(auVar105,auVar105);
                local_a40._0_4_ = fVar252 * -2.0;
                local_a20._0_4_ = fVar247;
                auVar96 = ZEXT416((uint)fVar252);
              }
              fVar247 = auVar96._0_4_;
              auVar98 = vfnmadd231ss_fma(ZEXT416((uint)(fVar271 * (fVar247 + fVar247))),auVar96,
                                         auVar96);
              auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar271 + fVar271)),
                                         ZEXT416((uint)(fVar271 * fVar271 * 3.0)));
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * fVar247 * -3.0)),
                                        ZEXT416((uint)(fVar247 + fVar247)),auVar96);
              auVar96 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar109,
                                        ZEXT416((uint)local_a20._0_4_));
              fVar247 = auVar98._0_4_ * 0.5;
              fVar249 = auVar110._0_4_ * 0.5;
              fVar250 = auVar97._0_4_ * 0.5;
              fVar251 = auVar96._0_4_ * 0.5;
              auVar241._0_4_ = fVar251 * (float)local_9e0._0_4_;
              auVar241._4_4_ = fVar251 * (float)local_9e0._4_4_;
              auVar241._8_4_ = fVar251 * fStack_9d8;
              auVar241._12_4_ = fVar251 * fStack_9d4;
              auVar221._4_4_ = fVar250;
              auVar221._0_4_ = fVar250;
              auVar221._8_4_ = fVar250;
              auVar221._12_4_ = fVar250;
              auVar110 = vfmadd132ps_fma(auVar221,auVar241,local_9a0._0_16_);
              auVar201._4_4_ = fVar249;
              auVar201._0_4_ = fVar249;
              auVar201._8_4_ = fVar249;
              auVar201._12_4_ = fVar249;
              auVar110 = vfmadd132ps_fma(auVar201,auVar110,local_9c0._0_16_);
              auVar294._4_4_ = fVar247;
              auVar294._0_4_ = fVar247;
              auVar294._8_4_ = fVar247;
              auVar294._12_4_ = fVar247;
              local_a80._0_16_ = vfmadd132ps_fma(auVar294,auVar110,local_980._0_16_);
              local_a20._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar59._12_4_ = 0;
              auVar59._0_12_ = ZEXT812(0);
              fVar247 = local_a20._0_4_;
              auVar110 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar247));
              fVar249 = auVar110._0_4_;
              local_a40._0_16_ = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar247));
              auVar36._8_4_ = 0x80000000;
              auVar36._0_8_ = 0x8000000080000000;
              auVar36._12_4_ = 0x80000000;
              auVar96 = vxorps_avx512vl(local_a20._0_16_,auVar36);
              auVar110 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                          SUB6416(ZEXT464(0x40000000),0));
              local_900._0_4_ = auVar110._0_4_;
              local_aa0._0_4_ = auVar103._0_4_;
              if (fVar247 < auVar96._0_4_) {
                fVar250 = sqrtf(fVar247);
                auVar103 = ZEXT416((uint)local_aa0._0_4_);
                auVar110 = local_a80._0_16_;
              }
              else {
                auVar110 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                fVar250 = auVar110._0_4_;
                auVar110 = local_a80._0_16_;
              }
              fVar247 = fVar249 * 1.5 + fVar247 * -0.5 * fVar249 * fVar249 * fVar249;
              auVar260._0_4_ = auVar110._0_4_ * fVar247;
              auVar260._4_4_ = auVar110._4_4_ * fVar247;
              auVar260._8_4_ = auVar110._8_4_ * fVar247;
              auVar260._12_4_ = auVar110._12_4_ * fVar247;
              auVar96 = vdpps_avx(auVar2,auVar260,0x7f);
              fVar252 = auVar103._0_4_;
              fVar249 = auVar96._0_4_;
              auVar181._0_4_ = fVar249 * fVar249;
              auVar181._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar181._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar181._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar97 = vsubps_avx512vl(auVar105,auVar181);
              fVar251 = auVar97._0_4_;
              auVar202._4_12_ = ZEXT812(0) << 0x20;
              auVar202._0_4_ = fVar251;
              auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar202);
              auVar99 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
              if (fVar251 < 0.0) {
                local_940 = fVar247;
                fStack_93c = fVar247;
                fStack_938 = fVar247;
                fStack_934 = fVar247;
                local_930 = auVar260;
                local_920 = auVar98;
                fVar251 = sqrtf(fVar251);
                auVar99 = ZEXT416(auVar99._0_4_);
                auVar103 = ZEXT416((uint)local_aa0._0_4_);
                auVar260 = local_930;
                auVar97 = local_920;
                auVar110 = local_a80._0_16_;
                fVar247 = local_940;
                fVar271 = fStack_93c;
                fVar272 = fStack_938;
                fVar273 = fStack_934;
              }
              else {
                auVar97 = vsqrtss_avx(auVar97,auVar97);
                fVar251 = auVar97._0_4_;
                auVar97 = auVar98;
                fVar271 = fVar247;
                fVar272 = fVar247;
                fVar273 = fVar247;
              }
              auVar192 = ZEXT1664(auVar2);
              auVar203._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar203._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar203._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar203._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar222._4_4_ = local_8c0._0_4_;
              auVar222._0_4_ = local_8c0._0_4_;
              auVar222._8_4_ = local_8c0._0_4_;
              auVar222._12_4_ = local_8c0._0_4_;
              auVar100 = vfmadd132ps_fma(auVar222,auVar203,local_9a0._0_16_);
              auVar204._4_4_ = local_8a0._0_4_;
              auVar204._0_4_ = local_8a0._0_4_;
              auVar204._8_4_ = local_8a0._0_4_;
              auVar204._12_4_ = local_8a0._0_4_;
              auVar100 = vfmadd132ps_fma(auVar204,auVar100,local_9c0._0_16_);
              auVar109 = vfmadd213ss_fma(auVar109,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000)
                                        );
              uVar193 = auVar109._0_4_;
              auVar223._4_4_ = uVar193;
              auVar223._0_4_ = uVar193;
              auVar223._8_4_ = uVar193;
              auVar223._12_4_ = uVar193;
              auVar109 = vfmadd132ps_fma(auVar223,auVar100,local_980._0_16_);
              auVar205._0_4_ = auVar109._0_4_ * (float)local_a20._0_4_;
              auVar205._4_4_ = auVar109._4_4_ * (float)local_a20._0_4_;
              auVar205._8_4_ = auVar109._8_4_ * (float)local_a20._0_4_;
              auVar205._12_4_ = auVar109._12_4_ * (float)local_a20._0_4_;
              auVar109 = vdpps_avx(auVar110,auVar109,0x7f);
              fVar211 = auVar109._0_4_;
              auVar224._0_4_ = auVar110._0_4_ * fVar211;
              auVar224._4_4_ = auVar110._4_4_ * fVar211;
              auVar224._8_4_ = auVar110._8_4_ * fVar211;
              auVar224._12_4_ = auVar110._12_4_ * fVar211;
              auVar109 = vsubps_avx(auVar205,auVar224);
              fVar211 = (float)local_900._0_4_ * (float)local_a40._0_4_;
              auVar100 = vmaxss_avx(ZEXT416((uint)fVar228),
                                    ZEXT416((uint)(local_800._0_4_ * fVar253 * 1.9073486e-06)));
              auVar37._8_4_ = 0x80000000;
              auVar37._0_8_ = 0x8000000080000000;
              auVar37._12_4_ = 0x80000000;
              auVar166._16_48_ = local_800._16_48_;
              auVar102 = vxorps_avx512vl(auVar110,auVar37);
              auVar225._0_4_ = fVar247 * auVar109._0_4_ * fVar211;
              auVar225._4_4_ = fVar271 * auVar109._4_4_ * fVar211;
              auVar225._8_4_ = fVar272 * auVar109._8_4_ * fVar211;
              auVar225._12_4_ = fVar273 * auVar109._12_4_ * fVar211;
              auVar109 = vdpps_avx(auVar102,auVar260,0x7f);
              auVar101 = vfmadd213ss_fma(auVar103,ZEXT416((uint)fVar228),auVar100);
              auVar103 = vdpps_avx(auVar2,auVar225,0x7f);
              auVar101 = vfmadd213ss_fma(ZEXT416((uint)(fVar252 + 1.0)),
                                         ZEXT416((uint)(fVar228 / fVar250)),auVar101);
              fVar247 = auVar109._0_4_ + auVar103._0_4_;
              auVar292 = ZEXT464((uint)fVar247);
              auVar109 = vdpps_avx(local_9f0,auVar260,0x7f);
              auVar103 = vdpps_avx(auVar2,auVar102,0x7f);
              auVar99 = vmulss_avx512f(auVar99,auVar97);
              fVar250 = auVar98._0_4_ * 1.5 + auVar99._0_4_ * auVar97._0_4_ * auVar97._0_4_;
              auVar97 = vdpps_avx(auVar2,local_9f0,0x7f);
              auVar99 = vfnmadd231ss_fma(auVar103,auVar96,ZEXT416((uint)fVar247));
              auVar97 = vfnmadd231ss_fma(auVar97,auVar96,auVar109);
              auVar103 = vpermilps_avx(_local_880,0xff);
              fVar251 = fVar251 - auVar103._0_4_;
              auVar98 = vshufps_avx(auVar110,auVar110,0xff);
              auVar103 = vfmsub213ss_fma(auVar99,ZEXT416((uint)fVar250),auVar98);
              auVar283._8_4_ = 0x80000000;
              auVar283._0_8_ = 0x8000000080000000;
              auVar283._12_4_ = 0x80000000;
              auVar285 = ZEXT1664(auVar283);
              auVar278._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar278._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar278._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar280 = ZEXT1664(auVar278);
              auVar97 = ZEXT416((uint)(auVar97._0_4_ * fVar250));
              auVar99 = vfmsub231ss_fma(ZEXT416((uint)(auVar109._0_4_ * auVar103._0_4_)),
                                        ZEXT416((uint)fVar247),auVar97);
              auVar103 = vinsertps_avx(auVar278,auVar97,0x1c);
              auVar264._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
              auVar264._8_4_ = auVar109._8_4_ ^ 0x80000000;
              auVar264._12_4_ = auVar109._12_4_ ^ 0x80000000;
              auVar97 = vinsertps_avx(ZEXT416((uint)fVar247),auVar264,0x10);
              auVar242._0_4_ = auVar99._0_4_;
              auVar242._4_4_ = auVar242._0_4_;
              auVar242._8_4_ = auVar242._0_4_;
              auVar242._12_4_ = auVar242._0_4_;
              auVar109 = vdivps_avx(auVar103,auVar242);
              auVar103 = vdivps_avx(auVar97,auVar242);
              auVar243._0_4_ = fVar249 * auVar109._0_4_ + fVar251 * auVar103._0_4_;
              auVar243._4_4_ = fVar249 * auVar109._4_4_ + fVar251 * auVar103._4_4_;
              auVar243._8_4_ = fVar249 * auVar109._8_4_ + fVar251 * auVar103._8_4_;
              auVar243._12_4_ = fVar249 * auVar109._12_4_ + fVar251 * auVar103._12_4_;
              auVar109 = vsubps_avx(local_800._0_16_,auVar243);
              auVar164 = ZEXT1664(auVar109);
              auVar38._8_4_ = 0x7fffffff;
              auVar38._0_8_ = 0x7fffffff7fffffff;
              auVar38._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar96,auVar38);
            } while (auVar101._0_4_ <= auVar103._0_4_);
            auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar101._0_4_ + auVar100._0_4_)),local_950,
                                       ZEXT416(0x36000000));
            auVar39._8_4_ = 0x7fffffff;
            auVar39._0_8_ = 0x7fffffff7fffffff;
            auVar39._12_4_ = 0x7fffffff;
            auVar96 = vandps_avx512vl(ZEXT416((uint)fVar251),auVar39);
          } while (auVar103._0_4_ <= auVar96._0_4_);
          fVar253 = auVar109._0_4_ + (float)local_960._0_4_;
          if (fVar24 <= fVar253) {
            fVar228 = *(float *)(ray + k * 4 + 0x200);
            if (fVar253 <= fVar228) {
              auVar109 = vmovshdup_avx(auVar109);
              fVar249 = auVar109._0_4_;
              if ((0.0 <= fVar249) && (fVar249 <= 1.0)) {
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT412(0);
                auVar166._4_12_ = ZEXT412(0);
                auVar166._0_4_ = fVar248;
                auVar109 = vrsqrt14ss_avx512f(auVar60 << 0x20,auVar166._0_16_);
                fVar248 = auVar109._0_4_;
                auVar105 = vmulss_avx512f(auVar105,ZEXT416(0xbf000000));
                pGVar5 = (context->scene->geometries).items[uVar3].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar248 = fVar248 * 1.5 + auVar105._0_4_ * fVar248 * fVar248 * fVar248;
                  auVar244._0_4_ = auVar2._0_4_ * fVar248;
                  auVar244._4_4_ = auVar2._4_4_ * fVar248;
                  auVar244._8_4_ = auVar2._8_4_ * fVar248;
                  auVar244._12_4_ = auVar2._12_4_ * fVar248;
                  auVar103 = vfmadd213ps_fma(auVar98,auVar244,auVar110);
                  auVar105 = vshufps_avx(auVar244,auVar244,0xc9);
                  auVar109 = vshufps_avx(auVar110,auVar110,0xc9);
                  auVar245._0_4_ = auVar244._0_4_ * auVar109._0_4_;
                  auVar245._4_4_ = auVar244._4_4_ * auVar109._4_4_;
                  auVar245._8_4_ = auVar244._8_4_ * auVar109._8_4_;
                  auVar245._12_4_ = auVar244._12_4_ * auVar109._12_4_;
                  auVar110 = vfmsub231ps_fma(auVar245,auVar110,auVar105);
                  auVar105 = vshufps_avx(auVar110,auVar110,0xc9);
                  auVar109 = vshufps_avx(auVar103,auVar103,0xc9);
                  auVar110 = vshufps_avx(auVar110,auVar110,0xd2);
                  auVar182._0_4_ = auVar103._0_4_ * auVar110._0_4_;
                  auVar182._4_4_ = auVar103._4_4_ * auVar110._4_4_;
                  auVar182._8_4_ = auVar103._8_4_ * auVar110._8_4_;
                  auVar182._12_4_ = auVar103._12_4_ * auVar110._12_4_;
                  auVar105 = vfmsub231ps_fma(auVar182,auVar105,auVar109);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar253;
                    uVar193 = vextractps_avx(auVar105,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar193;
                    uVar193 = vextractps_avx(auVar105,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar193;
                    *(int *)(ray + k * 4 + 0x380) = auVar105._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar249;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar4;
                    *(uint *)(ray + k * 4 + 0x480) = uVar3;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auVar267 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar267,auVar164);
                    auVar164 = vpermps_avx512f(auVar267,ZEXT1664(auVar105));
                    auVar267 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar267,ZEXT1664(auVar105));
                    local_380 = vbroadcastss_avx512f(auVar105);
                    local_400[0] = (RTCHitN)auVar164[0];
                    local_400[1] = (RTCHitN)auVar164[1];
                    local_400[2] = (RTCHitN)auVar164[2];
                    local_400[3] = (RTCHitN)auVar164[3];
                    local_400[4] = (RTCHitN)auVar164[4];
                    local_400[5] = (RTCHitN)auVar164[5];
                    local_400[6] = (RTCHitN)auVar164[6];
                    local_400[7] = (RTCHitN)auVar164[7];
                    local_400[8] = (RTCHitN)auVar164[8];
                    local_400[9] = (RTCHitN)auVar164[9];
                    local_400[10] = (RTCHitN)auVar164[10];
                    local_400[0xb] = (RTCHitN)auVar164[0xb];
                    local_400[0xc] = (RTCHitN)auVar164[0xc];
                    local_400[0xd] = (RTCHitN)auVar164[0xd];
                    local_400[0xe] = (RTCHitN)auVar164[0xe];
                    local_400[0xf] = (RTCHitN)auVar164[0xf];
                    local_400[0x10] = (RTCHitN)auVar164[0x10];
                    local_400[0x11] = (RTCHitN)auVar164[0x11];
                    local_400[0x12] = (RTCHitN)auVar164[0x12];
                    local_400[0x13] = (RTCHitN)auVar164[0x13];
                    local_400[0x14] = (RTCHitN)auVar164[0x14];
                    local_400[0x15] = (RTCHitN)auVar164[0x15];
                    local_400[0x16] = (RTCHitN)auVar164[0x16];
                    local_400[0x17] = (RTCHitN)auVar164[0x17];
                    local_400[0x18] = (RTCHitN)auVar164[0x18];
                    local_400[0x19] = (RTCHitN)auVar164[0x19];
                    local_400[0x1a] = (RTCHitN)auVar164[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar164[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar164[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar164[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar164[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar164[0x1f];
                    local_400[0x20] = (RTCHitN)auVar164[0x20];
                    local_400[0x21] = (RTCHitN)auVar164[0x21];
                    local_400[0x22] = (RTCHitN)auVar164[0x22];
                    local_400[0x23] = (RTCHitN)auVar164[0x23];
                    local_400[0x24] = (RTCHitN)auVar164[0x24];
                    local_400[0x25] = (RTCHitN)auVar164[0x25];
                    local_400[0x26] = (RTCHitN)auVar164[0x26];
                    local_400[0x27] = (RTCHitN)auVar164[0x27];
                    local_400[0x28] = (RTCHitN)auVar164[0x28];
                    local_400[0x29] = (RTCHitN)auVar164[0x29];
                    local_400[0x2a] = (RTCHitN)auVar164[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar164[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar164[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar164[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar164[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar164[0x2f];
                    local_400[0x30] = (RTCHitN)auVar164[0x30];
                    local_400[0x31] = (RTCHitN)auVar164[0x31];
                    local_400[0x32] = (RTCHitN)auVar164[0x32];
                    local_400[0x33] = (RTCHitN)auVar164[0x33];
                    local_400[0x34] = (RTCHitN)auVar164[0x34];
                    local_400[0x35] = (RTCHitN)auVar164[0x35];
                    local_400[0x36] = (RTCHitN)auVar164[0x36];
                    local_400[0x37] = (RTCHitN)auVar164[0x37];
                    local_400[0x38] = (RTCHitN)auVar164[0x38];
                    local_400[0x39] = (RTCHitN)auVar164[0x39];
                    local_400[0x3a] = (RTCHitN)auVar164[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar164[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar164[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar164[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar164[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar164[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar164 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar164);
                    auVar123 = vpcmpeqd_avx2(auVar164._0_32_,auVar164._0_32_);
                    local_a48[3] = auVar123;
                    local_a48[2] = auVar123;
                    local_a48[1] = auVar123;
                    *local_a48 = auVar123;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar253;
                    auVar164 = vmovdqa64_avx512f(local_4c0);
                    local_7c0 = vmovdqa64_avx512f(auVar164);
                    local_ad0.valid = (int *)local_7c0;
                    local_ad0.geometryUserPtr = pGVar5->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_400;
                    local_ad0.N = 0x10;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar280 = ZEXT1664(auVar278);
                      auVar285 = ZEXT1664(auVar283);
                      auVar192 = ZEXT1664(auVar2);
                      auVar292 = ZEXT1664(ZEXT416((uint)fVar247));
                      (*pGVar5->intersectionFilterN)(&local_ad0);
                      auVar164 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar27 = vptestmd_avx512f(auVar164,auVar164);
                    if ((short)uVar27 != 0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar280 = ZEXT1664(auVar280._0_16_);
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar192 = ZEXT1664(auVar192._0_16_);
                        auVar292 = ZEXT1664(auVar292._0_16_);
                        (*p_Var10)(&local_ad0);
                        auVar164 = vmovdqa64_avx512f(local_7c0);
                      }
                      uVar90 = vptestmd_avx512f(auVar164,auVar164);
                      if ((short)uVar90 != 0) {
                        iVar61 = *(int *)(local_ad0.hit + 4);
                        iVar62 = *(int *)(local_ad0.hit + 8);
                        iVar63 = *(int *)(local_ad0.hit + 0xc);
                        iVar64 = *(int *)(local_ad0.hit + 0x10);
                        iVar65 = *(int *)(local_ad0.hit + 0x14);
                        iVar66 = *(int *)(local_ad0.hit + 0x18);
                        iVar67 = *(int *)(local_ad0.hit + 0x1c);
                        iVar68 = *(int *)(local_ad0.hit + 0x20);
                        iVar69 = *(int *)(local_ad0.hit + 0x24);
                        iVar70 = *(int *)(local_ad0.hit + 0x28);
                        iVar71 = *(int *)(local_ad0.hit + 0x2c);
                        iVar72 = *(int *)(local_ad0.hit + 0x30);
                        iVar73 = *(int *)(local_ad0.hit + 0x34);
                        iVar74 = *(int *)(local_ad0.hit + 0x38);
                        iVar75 = *(int *)(local_ad0.hit + 0x3c);
                        bVar80 = (byte)uVar90;
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar82 = (byte)(uVar90 >> 8);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x300) =
                             (uint)(bVar80 & 1) * *(int *)local_ad0.hit |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x300);
                        *(uint *)(local_ad0.ray + 0x304) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x304)
                        ;
                        *(uint *)(local_ad0.ray + 0x308) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x308)
                        ;
                        *(uint *)(local_ad0.ray + 0x30c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x30c)
                        ;
                        *(uint *)(local_ad0.ray + 0x310) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x310)
                        ;
                        *(uint *)(local_ad0.ray + 0x314) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x314)
                        ;
                        *(uint *)(local_ad0.ray + 0x318) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x318)
                        ;
                        *(uint *)(local_ad0.ray + 0x31c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x31c)
                        ;
                        *(uint *)(local_ad0.ray + 800) =
                             (uint)(bVar82 & 1) * iVar68 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 800);
                        *(uint *)(local_ad0.ray + 0x324) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x324)
                        ;
                        *(uint *)(local_ad0.ray + 0x328) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x328)
                        ;
                        *(uint *)(local_ad0.ray + 0x32c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x32c)
                        ;
                        *(uint *)(local_ad0.ray + 0x330) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x330)
                        ;
                        *(uint *)(local_ad0.ray + 0x334) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x334)
                        ;
                        *(uint *)(local_ad0.ray + 0x338) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x338)
                        ;
                        *(uint *)(local_ad0.ray + 0x33c) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x33c)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0x44);
                        iVar62 = *(int *)(local_ad0.hit + 0x48);
                        iVar63 = *(int *)(local_ad0.hit + 0x4c);
                        iVar64 = *(int *)(local_ad0.hit + 0x50);
                        iVar65 = *(int *)(local_ad0.hit + 0x54);
                        iVar66 = *(int *)(local_ad0.hit + 0x58);
                        iVar67 = *(int *)(local_ad0.hit + 0x5c);
                        iVar68 = *(int *)(local_ad0.hit + 0x60);
                        iVar69 = *(int *)(local_ad0.hit + 100);
                        iVar70 = *(int *)(local_ad0.hit + 0x68);
                        iVar71 = *(int *)(local_ad0.hit + 0x6c);
                        iVar72 = *(int *)(local_ad0.hit + 0x70);
                        iVar73 = *(int *)(local_ad0.hit + 0x74);
                        iVar74 = *(int *)(local_ad0.hit + 0x78);
                        iVar75 = *(int *)(local_ad0.hit + 0x7c);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x340) =
                             (uint)(bVar80 & 1) * *(int *)(local_ad0.hit + 0x40) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x340);
                        *(uint *)(local_ad0.ray + 0x344) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x344)
                        ;
                        *(uint *)(local_ad0.ray + 0x348) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x348)
                        ;
                        *(uint *)(local_ad0.ray + 0x34c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x34c)
                        ;
                        *(uint *)(local_ad0.ray + 0x350) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x350)
                        ;
                        *(uint *)(local_ad0.ray + 0x354) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x354)
                        ;
                        *(uint *)(local_ad0.ray + 0x358) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x358)
                        ;
                        *(uint *)(local_ad0.ray + 0x35c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x35c)
                        ;
                        *(uint *)(local_ad0.ray + 0x360) =
                             (uint)(bVar82 & 1) * iVar68 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x360);
                        *(uint *)(local_ad0.ray + 0x364) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x364)
                        ;
                        *(uint *)(local_ad0.ray + 0x368) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x368)
                        ;
                        *(uint *)(local_ad0.ray + 0x36c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x36c)
                        ;
                        *(uint *)(local_ad0.ray + 0x370) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x370)
                        ;
                        *(uint *)(local_ad0.ray + 0x374) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x374)
                        ;
                        *(uint *)(local_ad0.ray + 0x378) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x378)
                        ;
                        *(uint *)(local_ad0.ray + 0x37c) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x37c)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0x84);
                        iVar62 = *(int *)(local_ad0.hit + 0x88);
                        iVar63 = *(int *)(local_ad0.hit + 0x8c);
                        iVar64 = *(int *)(local_ad0.hit + 0x90);
                        iVar65 = *(int *)(local_ad0.hit + 0x94);
                        iVar66 = *(int *)(local_ad0.hit + 0x98);
                        iVar67 = *(int *)(local_ad0.hit + 0x9c);
                        iVar68 = *(int *)(local_ad0.hit + 0xa0);
                        iVar69 = *(int *)(local_ad0.hit + 0xa4);
                        iVar70 = *(int *)(local_ad0.hit + 0xa8);
                        iVar71 = *(int *)(local_ad0.hit + 0xac);
                        iVar72 = *(int *)(local_ad0.hit + 0xb0);
                        iVar73 = *(int *)(local_ad0.hit + 0xb4);
                        iVar74 = *(int *)(local_ad0.hit + 0xb8);
                        iVar75 = *(int *)(local_ad0.hit + 0xbc);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x380) =
                             (uint)(bVar80 & 1) * *(int *)(local_ad0.hit + 0x80) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x380);
                        *(uint *)(local_ad0.ray + 900) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 900);
                        *(uint *)(local_ad0.ray + 0x388) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x388)
                        ;
                        *(uint *)(local_ad0.ray + 0x38c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x38c)
                        ;
                        *(uint *)(local_ad0.ray + 0x390) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x390)
                        ;
                        *(uint *)(local_ad0.ray + 0x394) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x394)
                        ;
                        *(uint *)(local_ad0.ray + 0x398) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x398)
                        ;
                        *(uint *)(local_ad0.ray + 0x39c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x39c)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a0) =
                             (uint)(bVar82 & 1) * iVar68 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                        *(uint *)(local_ad0.ray + 0x3a4) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3a4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a8) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3a8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3ac) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3ac)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b0) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x3b0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b4) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x3b4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b8) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x3b8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3bc) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x3bc)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0xc4);
                        iVar62 = *(int *)(local_ad0.hit + 200);
                        iVar63 = *(int *)(local_ad0.hit + 0xcc);
                        iVar64 = *(int *)(local_ad0.hit + 0xd0);
                        iVar65 = *(int *)(local_ad0.hit + 0xd4);
                        iVar66 = *(int *)(local_ad0.hit + 0xd8);
                        iVar67 = *(int *)(local_ad0.hit + 0xdc);
                        iVar68 = *(int *)(local_ad0.hit + 0xe0);
                        iVar69 = *(int *)(local_ad0.hit + 0xe4);
                        iVar70 = *(int *)(local_ad0.hit + 0xe8);
                        iVar71 = *(int *)(local_ad0.hit + 0xec);
                        iVar72 = *(int *)(local_ad0.hit + 0xf0);
                        iVar73 = *(int *)(local_ad0.hit + 0xf4);
                        iVar74 = *(int *)(local_ad0.hit + 0xf8);
                        iVar75 = *(int *)(local_ad0.hit + 0xfc);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x3c0) =
                             (uint)(bVar80 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                        *(uint *)(local_ad0.ray + 0x3c4) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x3c4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3c8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3c8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3cc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3cc)
                        ;
                        *(uint *)(local_ad0.ray + 0x3d0) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3d0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3d4) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3d4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3d8) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3d8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3dc) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3dc)
                        ;
                        *(uint *)(local_ad0.ray + 0x3e0) =
                             (uint)(bVar82 & 1) * iVar68 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                        *(uint *)(local_ad0.ray + 0x3e4) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3e4)
                        ;
                        *(uint *)(local_ad0.ray + 1000) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 1000);
                        *(uint *)(local_ad0.ray + 0x3ec) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x3ec)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f0) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x3f0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f4) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x3f4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f8) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x3f8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3fc) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x3fc)
                        ;
                        iVar61 = *(int *)(local_ad0.hit + 0x104);
                        iVar62 = *(int *)(local_ad0.hit + 0x108);
                        iVar63 = *(int *)(local_ad0.hit + 0x10c);
                        iVar64 = *(int *)(local_ad0.hit + 0x110);
                        iVar65 = *(int *)(local_ad0.hit + 0x114);
                        iVar66 = *(int *)(local_ad0.hit + 0x118);
                        iVar67 = *(int *)(local_ad0.hit + 0x11c);
                        iVar68 = *(int *)(local_ad0.hit + 0x120);
                        iVar69 = *(int *)(local_ad0.hit + 0x124);
                        iVar70 = *(int *)(local_ad0.hit + 0x128);
                        iVar71 = *(int *)(local_ad0.hit + 300);
                        iVar72 = *(int *)(local_ad0.hit + 0x130);
                        iVar73 = *(int *)(local_ad0.hit + 0x134);
                        iVar74 = *(int *)(local_ad0.hit + 0x138);
                        iVar75 = *(int *)(local_ad0.hit + 0x13c);
                        bVar89 = (bool)((byte)(uVar90 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar90 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar90 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar90 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar90 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar90 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar90 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar90 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar90 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar90 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar90 >> 0xe) & 1);
                        bVar23 = SUB81(uVar90 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x400) =
                             (uint)(bVar80 & 1) * *(int *)(local_ad0.hit + 0x100) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x400);
                        *(uint *)(local_ad0.ray + 0x404) =
                             (uint)bVar89 * iVar61 | (uint)!bVar89 * *(int *)(local_ad0.ray + 0x404)
                        ;
                        *(uint *)(local_ad0.ray + 0x408) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x408)
                        ;
                        *(uint *)(local_ad0.ray + 0x40c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x40c)
                        ;
                        *(uint *)(local_ad0.ray + 0x410) =
                             (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x410)
                        ;
                        *(uint *)(local_ad0.ray + 0x414) =
                             (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x414)
                        ;
                        *(uint *)(local_ad0.ray + 0x418) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x418)
                        ;
                        *(uint *)(local_ad0.ray + 0x41c) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x41c)
                        ;
                        *(uint *)(local_ad0.ray + 0x420) =
                             (uint)(bVar82 & 1) * iVar68 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_ad0.ray + 0x420);
                        *(uint *)(local_ad0.ray + 0x424) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x424)
                        ;
                        *(uint *)(local_ad0.ray + 0x428) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x428)
                        ;
                        *(uint *)(local_ad0.ray + 0x42c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_ad0.ray + 0x42c)
                        ;
                        *(uint *)(local_ad0.ray + 0x430) =
                             (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_ad0.ray + 0x430)
                        ;
                        *(uint *)(local_ad0.ray + 0x434) =
                             (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_ad0.ray + 0x434)
                        ;
                        *(uint *)(local_ad0.ray + 0x438) =
                             (uint)bVar22 * iVar74 | (uint)!bVar22 * *(int *)(local_ad0.ray + 0x438)
                        ;
                        *(uint *)(local_ad0.ray + 0x43c) =
                             (uint)bVar23 * iVar75 | (uint)!bVar23 * *(int *)(local_ad0.ray + 0x43c)
                        ;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                        auVar164 = vmovdqu32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar164;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                        auVar164 = vmovdqu32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar164;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                        auVar164 = vmovdqa32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar164;
                        auVar164 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                        auVar164 = vmovdqa32_avx512f(auVar164);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar164;
                        goto LAB_0194e5ff;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar228;
                  }
                }
              }
            }
          }
LAB_0194e5ff:
          uVar193 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar266._4_4_ = uVar193;
          auVar266._0_4_ = uVar193;
          auVar266._8_4_ = uVar193;
          auVar266._12_4_ = uVar193;
          auVar266._16_4_ = uVar193;
          auVar266._20_4_ = uVar193;
          auVar266._24_4_ = uVar193;
          auVar266._28_4_ = uVar193;
          auVar164 = ZEXT3264(auVar266);
          auVar77._4_4_ = fStack_73c;
          auVar77._0_4_ = local_740;
          auVar77._8_4_ = fStack_738;
          auVar77._12_4_ = fStack_734;
          auVar77._16_4_ = fStack_730;
          auVar77._20_4_ = fStack_72c;
          auVar77._24_4_ = fStack_728;
          auVar77._28_4_ = fStack_724;
          uVar27 = vcmpps_avx512vl(auVar266,auVar77,0xd);
          bVar86 = ~('\x01' << ((byte)iVar31 & 0x1f)) & bVar86 & (byte)uVar27;
        }
        uVar30 = vpcmpd_avx512vl(local_700,local_680,1);
        uVar29 = vpcmpd_avx512vl(local_700,_local_760,1);
        auVar208._0_4_ = (float)local_820._0_4_ + (float)local_540._0_4_;
        auVar208._4_4_ = (float)local_820._4_4_ + (float)local_540._4_4_;
        auVar208._8_4_ = fStack_818 + fStack_538;
        auVar208._12_4_ = fStack_814 + fStack_534;
        auVar208._16_4_ = fStack_810 + fStack_530;
        auVar208._20_4_ = fStack_80c + fStack_52c;
        auVar208._24_4_ = fStack_808 + fStack_528;
        auVar208._28_4_ = fStack_804 + fStack_524;
        uVar193 = auVar164._0_4_;
        auVar226._4_4_ = uVar193;
        auVar226._0_4_ = uVar193;
        auVar226._8_4_ = uVar193;
        auVar226._12_4_ = uVar193;
        auVar226._16_4_ = uVar193;
        auVar226._20_4_ = uVar193;
        auVar226._24_4_ = uVar193;
        auVar226._28_4_ = uVar193;
        uVar27 = vcmpps_avx512vl(auVar208,auVar226,2);
        bVar85 = bVar85 & (byte)uVar30 & (byte)uVar27;
        auVar246._0_4_ = (float)local_820._0_4_ + local_6c0._0_4_;
        auVar246._4_4_ = (float)local_820._4_4_ + local_6c0._4_4_;
        auVar246._8_4_ = fStack_818 + local_6c0._8_4_;
        auVar246._12_4_ = fStack_814 + local_6c0._12_4_;
        auVar246._16_4_ = fStack_810 + local_6c0._16_4_;
        auVar246._20_4_ = fStack_80c + local_6c0._20_4_;
        auVar246._24_4_ = fStack_808 + local_6c0._24_4_;
        auVar246._28_4_ = fStack_804 + local_6c0._28_4_;
        uVar27 = vcmpps_avx512vl(auVar246,auVar226,2);
        bVar79 = bVar79 & (byte)uVar29 & (byte)uVar27 | bVar85;
        if (bVar79 != 0) {
          abStack_1a0[uVar84 * 0x60] = bVar79;
          auVar162._0_4_ =
               (uint)(bVar85 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar85 & 1) * (int)local_6c0._0_4_;
          bVar89 = (bool)(bVar85 >> 1 & 1);
          auVar162._4_4_ = (uint)bVar89 * local_540._4_4_ | (uint)!bVar89 * (int)local_6c0._4_4_;
          bVar89 = (bool)(bVar85 >> 2 & 1);
          auVar162._8_4_ = (uint)bVar89 * (int)fStack_538 | (uint)!bVar89 * (int)local_6c0._8_4_;
          bVar89 = (bool)(bVar85 >> 3 & 1);
          auVar162._12_4_ = (uint)bVar89 * (int)fStack_534 | (uint)!bVar89 * (int)local_6c0._12_4_;
          bVar89 = (bool)(bVar85 >> 4 & 1);
          auVar162._16_4_ = (uint)bVar89 * (int)fStack_530 | (uint)!bVar89 * (int)local_6c0._16_4_;
          bVar89 = (bool)(bVar85 >> 5 & 1);
          auVar162._20_4_ = (uint)bVar89 * (int)fStack_52c | (uint)!bVar89 * (int)local_6c0._20_4_;
          auVar162._24_4_ =
               (uint)(bVar85 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar85 >> 6) * (int)local_6c0._24_4_;
          auVar162._28_4_ = local_6c0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar84 * 0x60) = auVar162;
          uVar90 = vmovlps_avx(local_710);
          (&uStack_160)[uVar84 * 0xc] = uVar90;
          aiStack_158[uVar84 * 0x18] = iVar87 + 1;
          uVar84 = (ulong)((int)uVar84 + 1);
        }
      }
      auVar267 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar91 = (uint)uVar84;
      uVar84 = (ulong)(uVar91 - 1);
      if (uVar91 == 0) {
        uVar193 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar40._4_4_ = uVar193;
        auVar40._0_4_ = uVar193;
        auVar40._8_4_ = uVar193;
        auVar40._12_4_ = uVar193;
        uVar27 = vcmpps_avx512vl(local_720,auVar40,2);
        local_908 = (ulong)((uint)uVar27 & (uint)local_908 - 1 & (uint)local_908);
        goto LAB_0194bf56;
      }
      lVar83 = uVar84 * 0x60;
      auVar123 = *(undefined1 (*) [32])(auStack_180 + lVar83);
      auVar209._0_4_ = auVar123._0_4_ + (float)local_820._0_4_;
      auVar209._4_4_ = auVar123._4_4_ + (float)local_820._4_4_;
      auVar209._8_4_ = auVar123._8_4_ + fStack_818;
      auVar209._12_4_ = auVar123._12_4_ + fStack_814;
      auVar209._16_4_ = auVar123._16_4_ + fStack_810;
      auVar209._20_4_ = auVar123._20_4_ + fStack_80c;
      auVar209._24_4_ = auVar123._24_4_ + fStack_808;
      auVar209._28_4_ = auVar123._28_4_ + fStack_804;
      uVar193 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar46._4_4_ = uVar193;
      auVar46._0_4_ = uVar193;
      auVar46._8_4_ = uVar193;
      auVar46._12_4_ = uVar193;
      auVar46._16_4_ = uVar193;
      auVar46._20_4_ = uVar193;
      auVar46._24_4_ = uVar193;
      auVar46._28_4_ = uVar193;
      uVar27 = vcmpps_avx512vl(auVar209,auVar46,2);
      uVar167 = (uint)uVar27 & (uint)abStack_1a0[lVar83];
    } while (uVar167 == 0);
    uVar90 = (&uStack_160)[uVar84 * 0xc];
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar90;
    auVar227._8_4_ = 0x7f800000;
    auVar227._0_8_ = 0x7f8000007f800000;
    auVar227._12_4_ = 0x7f800000;
    auVar227._16_4_ = 0x7f800000;
    auVar227._20_4_ = 0x7f800000;
    auVar227._24_4_ = 0x7f800000;
    auVar227._28_4_ = 0x7f800000;
    auVar122 = vblendmps_avx512vl(auVar227,auVar123);
    bVar79 = (byte)uVar167;
    auVar163._0_4_ =
         (uint)(bVar79 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)auVar123._0_4_;
    bVar89 = (bool)((byte)(uVar167 >> 1) & 1);
    auVar163._4_4_ = (uint)bVar89 * auVar122._4_4_ | (uint)!bVar89 * (int)auVar123._4_4_;
    bVar89 = (bool)((byte)(uVar167 >> 2) & 1);
    auVar163._8_4_ = (uint)bVar89 * auVar122._8_4_ | (uint)!bVar89 * (int)auVar123._8_4_;
    bVar89 = (bool)((byte)(uVar167 >> 3) & 1);
    auVar163._12_4_ = (uint)bVar89 * auVar122._12_4_ | (uint)!bVar89 * (int)auVar123._12_4_;
    bVar89 = (bool)((byte)(uVar167 >> 4) & 1);
    auVar163._16_4_ = (uint)bVar89 * auVar122._16_4_ | (uint)!bVar89 * (int)auVar123._16_4_;
    bVar89 = (bool)((byte)(uVar167 >> 5) & 1);
    auVar163._20_4_ = (uint)bVar89 * auVar122._20_4_ | (uint)!bVar89 * (int)auVar123._20_4_;
    bVar89 = (bool)((byte)(uVar167 >> 6) & 1);
    auVar163._24_4_ = (uint)bVar89 * auVar122._24_4_ | (uint)!bVar89 * (int)auVar123._24_4_;
    auVar163._28_4_ =
         (uVar167 >> 7) * auVar122._28_4_ | (uint)!SUB41(uVar167 >> 7,0) * (int)auVar123._28_4_;
    auVar123 = vshufps_avx(auVar163,auVar163,0xb1);
    auVar123 = vminps_avx(auVar163,auVar123);
    auVar122 = vshufpd_avx(auVar123,auVar123,5);
    auVar123 = vminps_avx(auVar123,auVar122);
    auVar122 = vpermpd_avx2(auVar123,0x4e);
    auVar123 = vminps_avx(auVar123,auVar122);
    uVar27 = vcmpps_avx512vl(auVar163,auVar123,0);
    bVar86 = (byte)uVar27 & bVar79;
    if (bVar86 != 0) {
      uVar167 = (uint)bVar86;
    }
    uVar168 = 0;
    for (; (uVar167 & 1) == 0; uVar167 = uVar167 >> 1 | 0x80000000) {
      uVar168 = uVar168 + 1;
    }
    iVar87 = aiStack_158[uVar84 * 0x18];
    bVar79 = ~('\x01' << ((byte)uVar168 & 0x1f)) & bVar79;
    abStack_1a0[lVar83] = bVar79;
    if (bVar79 == 0) {
      uVar91 = uVar91 - 1;
    }
    uVar193 = (undefined4)uVar90;
    auVar191._4_4_ = uVar193;
    auVar191._0_4_ = uVar193;
    auVar191._8_4_ = uVar193;
    auVar191._12_4_ = uVar193;
    auVar191._16_4_ = uVar193;
    auVar191._20_4_ = uVar193;
    auVar191._24_4_ = uVar193;
    auVar191._28_4_ = uVar193;
    auVar105 = vmovshdup_avx(auVar206);
    auVar105 = vsubps_avx(auVar105,auVar206);
    auVar210._0_4_ = auVar105._0_4_;
    auVar210._4_4_ = auVar210._0_4_;
    auVar210._8_4_ = auVar210._0_4_;
    auVar210._12_4_ = auVar210._0_4_;
    auVar210._16_4_ = auVar210._0_4_;
    auVar210._20_4_ = auVar210._0_4_;
    auVar210._24_4_ = auVar210._0_4_;
    auVar210._28_4_ = auVar210._0_4_;
    auVar105 = vfmadd132ps_fma(auVar210,auVar191,auVar267._0_32_);
    auVar123 = ZEXT1632(auVar105);
    local_400[0] = (RTCHitN)auVar123[0];
    local_400[1] = (RTCHitN)auVar123[1];
    local_400[2] = (RTCHitN)auVar123[2];
    local_400[3] = (RTCHitN)auVar123[3];
    local_400[4] = (RTCHitN)auVar123[4];
    local_400[5] = (RTCHitN)auVar123[5];
    local_400[6] = (RTCHitN)auVar123[6];
    local_400[7] = (RTCHitN)auVar123[7];
    local_400[8] = (RTCHitN)auVar123[8];
    local_400[9] = (RTCHitN)auVar123[9];
    local_400[10] = (RTCHitN)auVar123[10];
    local_400[0xb] = (RTCHitN)auVar123[0xb];
    local_400[0xc] = (RTCHitN)auVar123[0xc];
    local_400[0xd] = (RTCHitN)auVar123[0xd];
    local_400[0xe] = (RTCHitN)auVar123[0xe];
    local_400[0xf] = (RTCHitN)auVar123[0xf];
    local_400[0x10] = (RTCHitN)auVar123[0x10];
    local_400[0x11] = (RTCHitN)auVar123[0x11];
    local_400[0x12] = (RTCHitN)auVar123[0x12];
    local_400[0x13] = (RTCHitN)auVar123[0x13];
    local_400[0x14] = (RTCHitN)auVar123[0x14];
    local_400[0x15] = (RTCHitN)auVar123[0x15];
    local_400[0x16] = (RTCHitN)auVar123[0x16];
    local_400[0x17] = (RTCHitN)auVar123[0x17];
    local_400[0x18] = (RTCHitN)auVar123[0x18];
    local_400[0x19] = (RTCHitN)auVar123[0x19];
    local_400[0x1a] = (RTCHitN)auVar123[0x1a];
    local_400[0x1b] = (RTCHitN)auVar123[0x1b];
    local_400[0x1c] = (RTCHitN)auVar123[0x1c];
    local_400[0x1d] = (RTCHitN)auVar123[0x1d];
    local_400[0x1e] = (RTCHitN)auVar123[0x1e];
    local_400[0x1f] = (RTCHitN)auVar123[0x1f];
    auVar164 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar168 * 4));
    uVar84 = (ulong)uVar91;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }